

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  float fVar2;
  BVH *bvh;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  size_t k;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [28];
  undefined1 auVar64 [8];
  RTCHitN *pRVar65;
  byte bVar66;
  byte bVar67;
  int iVar68;
  AABBNodeMB4D *node1;
  ulong uVar69;
  undefined4 uVar70;
  ulong uVar71;
  byte bVar72;
  undefined1 (*pauVar73) [32];
  ulong uVar74;
  byte bVar75;
  float *vertices1;
  vuint<4> *v;
  long lVar76;
  uint uVar77;
  NodeRef root;
  ulong *puVar78;
  bool bVar79;
  ulong uVar80;
  ulong uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar83 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar84 [16];
  undefined1 auVar109 [32];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar124 [36];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 in_ZMM2 [64];
  undefined1 auVar132 [36];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar143 [64];
  undefined1 auVar152 [32];
  float fVar150;
  float fVar158;
  undefined1 auVar153 [32];
  undefined1 auVar151 [16];
  float fVar156;
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar155 [64];
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar170;
  undefined1 auVar165 [32];
  float fVar168;
  float fVar169;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [64];
  undefined1 auVar175 [32];
  float fVar174;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined1 auVar192 [32];
  undefined1 auVar191 [16];
  undefined1 auVar193 [64];
  undefined1 in_ZMM10 [64];
  float fVar195;
  undefined1 in_ZMM11 [64];
  undefined1 auVar194 [64];
  undefined1 auVar196 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar197 [64];
  uint uVar198;
  uint uVar201;
  uint uVar202;
  uint uVar203;
  undefined1 in_ZMM13 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar206 [36];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar207 [64];
  undefined1 auVar209 [36];
  undefined1 auVar208 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  vuint<4> *v_1;
  QuadMesh *mesh;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2b81;
  ulong local_2b80;
  ulong local_2b78;
  RayK<8> *local_2b70;
  undefined4 local_2b64;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [8];
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  float fStack_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  undefined4 uStack_2ae4;
  float local_2ae0 [4];
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  undefined4 uStack_2ac4;
  undefined1 (*local_2ab8) [32];
  Intersectors *local_2ab0;
  ulong local_2aa8;
  undefined1 local_2aa0 [32];
  ulong local_2a70;
  ulong local_2a68;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  undefined1 local_2960 [8];
  float fStack_2958;
  float fStack_2954;
  float fStack_2950;
  float fStack_294c;
  float fStack_2948;
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  uint local_28a0;
  uint uStack_289c;
  uint uStack_2898;
  uint uStack_2894;
  uint uStack_2890;
  uint uStack_288c;
  uint uStack_2888;
  uint uStack_2884;
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  int iStack_2844;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar154 [32];
  undefined1 auVar166 [32];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar85 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar82 = ZEXT816(0) << 0x40;
    uVar80 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar82),5);
    uVar71 = vpcmpeqd_avx512vl(auVar85,(undefined1  [32])valid_i->field_0);
    uVar80 = uVar80 & uVar71;
    bVar67 = (byte)uVar80;
    if (bVar67 != 0) {
      local_2ab0 = This;
      local_2840._0_4_ = *(float *)ray;
      local_2840._4_4_ = *(float *)(ray + 4);
      local_2840._8_4_ = *(float *)(ray + 8);
      local_2840._12_4_ = *(float *)(ray + 0xc);
      local_2840._16_4_ = *(float *)(ray + 0x10);
      local_2840._20_4_ = *(float *)(ray + 0x14);
      local_2840._24_4_ = *(float *)(ray + 0x18);
      local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2840._32_4_ = *(float *)(ray + 0x20);
      local_2840._36_4_ = *(float *)(ray + 0x24);
      local_2840._40_4_ = *(float *)(ray + 0x28);
      local_2840._44_4_ = *(float *)(ray + 0x2c);
      local_2840._48_4_ = *(float *)(ray + 0x30);
      local_2840._52_4_ = *(float *)(ray + 0x34);
      local_2840._56_4_ = *(float *)(ray + 0x38);
      local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2840._64_4_ = *(float *)(ray + 0x40);
      local_2840._68_4_ = *(float *)(ray + 0x44);
      local_2840._72_4_ = *(float *)(ray + 0x48);
      local_2840._76_4_ = *(float *)(ray + 0x4c);
      local_2840._80_4_ = *(float *)(ray + 0x50);
      local_2840._84_4_ = *(float *)(ray + 0x54);
      local_2840._88_4_ = *(float *)(ray + 0x58);
      local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar210 = ZEXT3264(auVar85);
      vandps_avx512vl(local_27e0,auVar85);
      auVar86._8_4_ = 0x219392ef;
      auVar86._0_8_ = 0x219392ef219392ef;
      auVar86._12_4_ = 0x219392ef;
      auVar86._16_4_ = 0x219392ef;
      auVar86._20_4_ = 0x219392ef;
      auVar86._24_4_ = 0x219392ef;
      auVar86._28_4_ = 0x219392ef;
      auVar193 = ZEXT3264(auVar86);
      uVar71 = vcmpps_avx512vl(auVar85,auVar86,1);
      bVar79 = (bool)((byte)uVar71 & 1);
      auVar88._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._0_4_;
      bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar88._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._4_4_;
      bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar88._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._8_4_;
      bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar88._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._12_4_;
      bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar88._16_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._16_4_;
      bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar88._20_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._20_4_;
      bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar88._24_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._24_4_;
      bVar79 = SUB81(uVar71 >> 7,0);
      auVar88._28_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27e0._28_4_;
      vandps_avx512vl(local_27c0,auVar85);
      uVar71 = vcmpps_avx512vl(auVar88,auVar86,1);
      bVar79 = (bool)((byte)uVar71 & 1);
      auVar89._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._0_4_;
      bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar89._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._4_4_;
      bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar89._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._8_4_;
      bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar89._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._12_4_;
      bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar89._16_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._16_4_;
      bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar89._20_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._20_4_;
      bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar89._24_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._24_4_;
      bVar79 = SUB81(uVar71 >> 7,0);
      auVar89._28_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27c0._28_4_;
      vandps_avx512vl(local_27a0,auVar85);
      uVar71 = vcmpps_avx512vl(auVar89,auVar86,1);
      bVar79 = (bool)((byte)uVar71 & 1);
      auVar85._0_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._0_4_;
      bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar85._4_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._4_4_;
      bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar85._8_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._8_4_;
      bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar85._12_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._12_4_;
      bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar85._16_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._16_4_;
      bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar85._20_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._20_4_;
      bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar85._24_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._24_4_;
      bVar79 = SUB81(uVar71 >> 7,0);
      auVar85._28_4_ = (uint)bVar79 * 0x219392ef | (uint)!bVar79 * local_27a0._28_4_;
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar211 = ZEXT3264(auVar86);
      auVar87 = vrcp14ps_avx512vl(auVar88);
      auVar88 = vfnmadd213ps_avx512vl(auVar88,auVar87,auVar86);
      auVar83 = vfmadd132ps_fma(auVar88,auVar87,auVar87);
      auVar155 = ZEXT1664(auVar83);
      auVar88 = vrcp14ps_avx512vl(auVar89);
      auVar89 = vfnmadd213ps_avx512vl(auVar89,auVar88,auVar86);
      auVar84 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
      auVar167 = ZEXT1664(auVar84);
      auVar88 = vrcp14ps_avx512vl(auVar85);
      auVar190 = ZEXT3264(auVar88);
      auVar85 = vfnmadd213ps_avx512vl(auVar85,auVar88,auVar86);
      local_2780 = ZEXT1632(auVar83);
      local_2760 = ZEXT1632(auVar84);
      auVar20 = vfmadd132ps_fma(auVar85,auVar88,auVar88);
      auVar180 = ZEXT1664(auVar20);
      local_2740 = ZEXT1632(auVar20);
      local_26e0._4_4_ = *(float *)(ray + 0x44) * auVar20._4_4_;
      local_26e0._0_4_ = *(float *)(ray + 0x40) * auVar20._0_4_;
      local_26e0._8_4_ = *(float *)(ray + 0x48) * auVar20._8_4_;
      local_26e0._12_4_ = *(float *)(ray + 0x4c) * auVar20._12_4_;
      local_26e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
      local_26e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
      local_26e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
      local_26e0._28_4_ = *(undefined4 *)(ray + 0x5c);
      auVar143 = ZEXT3264(local_26e0);
      local_2720 = *(float *)ray * auVar83._0_4_;
      fStack_271c = *(float *)(ray + 4) * auVar83._4_4_;
      fStack_2718 = *(float *)(ray + 8) * auVar83._8_4_;
      fStack_2714 = *(float *)(ray + 0xc) * auVar83._12_4_;
      fStack_2710 = *(float *)(ray + 0x10) * 0.0;
      fStack_270c = *(float *)(ray + 0x14) * 0.0;
      fStack_2708 = *(float *)(ray + 0x18) * 0.0;
      uStack_2704 = *(undefined4 *)(ray + 0x1c);
      local_2700 = *(float *)(ray + 0x20) * auVar84._0_4_;
      fStack_26fc = *(float *)(ray + 0x24) * auVar84._4_4_;
      fStack_26f8 = *(float *)(ray + 0x28) * auVar84._8_4_;
      fStack_26f4 = *(float *)(ray + 0x2c) * auVar84._12_4_;
      fStack_26f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_26ec = *(float *)(ray + 0x34) * 0.0;
      fStack_26e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_26e4 = *(undefined4 *)(ray + 0x3c);
      uVar71 = vcmpps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar82),1);
      auVar85 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_26c0 = (uint)((byte)uVar71 & 1) * auVar85._0_4_;
      iStack_26bc = (uint)((byte)(uVar71 >> 1) & 1) * auVar85._4_4_;
      iStack_26b8 = (uint)((byte)(uVar71 >> 2) & 1) * auVar85._8_4_;
      iStack_26b4 = (uint)((byte)(uVar71 >> 3) & 1) * auVar85._12_4_;
      iStack_26b0 = (uint)((byte)(uVar71 >> 4) & 1) * auVar85._16_4_;
      iStack_26ac = (uint)((byte)(uVar71 >> 5) & 1) * auVar85._20_4_;
      iStack_26a8 = (uint)((byte)(uVar71 >> 6) & 1) * auVar85._24_4_;
      iStack_26a4 = (uint)(byte)(uVar71 >> 7) * auVar85._28_4_;
      auVar88 = ZEXT1632(auVar82);
      uVar71 = vcmpps_avx512vl(ZEXT1632(auVar84),auVar88,5);
      auVar85 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar79 = (bool)((byte)uVar71 & 1);
      bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
      bVar14 = SUB81(uVar71 >> 7,0);
      local_26a0 = (uint)bVar79 * auVar85._0_4_ | (uint)!bVar79 * 0x30;
      uStack_269c = (uint)bVar8 * auVar85._4_4_ | (uint)!bVar8 * 0x30;
      uStack_2698 = (uint)bVar9 * auVar85._8_4_ | (uint)!bVar9 * 0x30;
      uStack_2694 = (uint)bVar10 * auVar85._12_4_ | (uint)!bVar10 * 0x30;
      uStack_2690 = (uint)bVar11 * auVar85._16_4_ | (uint)!bVar11 * 0x30;
      uStack_268c = (uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * 0x30;
      uStack_2688 = (uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * 0x30;
      uStack_2684 = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * 0x30;
      uVar71 = vcmpps_avx512vl(ZEXT1632(auVar20),auVar88,5);
      auVar85 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar79 = (bool)((byte)uVar71 & 1);
      bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
      bVar14 = SUB81(uVar71 >> 7,0);
      local_2680 = (uint)bVar79 * auVar85._0_4_ | (uint)!bVar79 * 0x50;
      uStack_267c = (uint)bVar8 * auVar85._4_4_ | (uint)!bVar8 * 0x50;
      uStack_2678 = (uint)bVar9 * auVar85._8_4_ | (uint)!bVar9 * 0x50;
      uStack_2674 = (uint)bVar10 * auVar85._12_4_ | (uint)!bVar10 * 0x50;
      uStack_2670 = (uint)bVar11 * auVar85._16_4_ | (uint)!bVar11 * 0x50;
      uStack_266c = (uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * 0x50;
      uStack_2668 = (uint)bVar13 * auVar85._24_4_ | (uint)!bVar13 * 0x50;
      uStack_2664 = (uint)bVar14 * auVar85._28_4_ | (uint)!bVar14 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar213 = ZEXT3264(local_1e80);
      local_2b64 = (undefined4)uVar80;
      auVar85 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar88);
      local_2660._0_4_ =
           (uint)(bVar67 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar67 & 1) * local_1e80._0_4_;
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      local_2660._4_4_ = (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_1e80._4_4_;
      bVar79 = (bool)((byte)(uVar80 >> 2) & 1);
      local_2660._8_4_ = (uint)bVar79 * auVar85._8_4_ | (uint)!bVar79 * local_1e80._8_4_;
      bVar79 = (bool)((byte)(uVar80 >> 3) & 1);
      local_2660._12_4_ = (uint)bVar79 * auVar85._12_4_ | (uint)!bVar79 * local_1e80._12_4_;
      bVar79 = (bool)((byte)(uVar80 >> 4) & 1);
      local_2660._16_4_ = (uint)bVar79 * auVar85._16_4_ | (uint)!bVar79 * local_1e80._16_4_;
      bVar79 = (bool)((byte)(uVar80 >> 5) & 1);
      local_2660._20_4_ = (uint)bVar79 * auVar85._20_4_ | (uint)!bVar79 * local_1e80._20_4_;
      bVar79 = (bool)((byte)(uVar80 >> 6) & 1);
      local_2660._24_4_ = (uint)bVar79 * auVar85._24_4_ | (uint)!bVar79 * local_1e80._24_4_;
      bVar79 = SUB81(uVar80 >> 7,0);
      local_2660._28_4_ = (uint)bVar79 * auVar85._28_4_ | (uint)!bVar79 * local_1e80._28_4_;
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar212 = ZEXT3264(auVar85);
      auVar88 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar88);
      bVar79 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar80 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar80 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar80 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar80 >> 6) & 1);
      bVar13 = SUB81(uVar80 >> 7,0);
      local_2640._4_4_ = (uint)bVar79 * auVar88._4_4_ | (uint)!bVar79 * auVar85._4_4_;
      local_2640._0_4_ =
           (uint)(bVar67 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar85._0_4_;
      local_2640._8_4_ = (uint)bVar8 * auVar88._8_4_ | (uint)!bVar8 * auVar85._8_4_;
      local_2640._12_4_ = (uint)bVar9 * auVar88._12_4_ | (uint)!bVar9 * auVar85._12_4_;
      local_2640._16_4_ = (uint)bVar10 * auVar88._16_4_ | (uint)!bVar10 * auVar85._16_4_;
      local_2640._20_4_ = (uint)bVar11 * auVar88._20_4_ | (uint)!bVar11 * auVar85._20_4_;
      local_2640._24_4_ = (uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar85._24_4_;
      local_2640._28_4_ = (uint)bVar13 * auVar88._28_4_ | (uint)!bVar13 * auVar85._28_4_;
      bVar67 = ~bVar67;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar80 = 5;
      }
      else {
        uVar80 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2b70 = ray + 0x100;
      puVar78 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar73 = (undefined1 (*) [32])local_1e40;
      local_2608 = (bvh->root).ptr;
      local_1e60 = local_2660;
      local_2ab8 = (undefined1 (*) [32])&local_28a0;
      auVar82 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
      auVar214 = ZEXT1664(auVar82);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar215 = ZEXT3264(auVar85);
      local_2aa8 = uVar80;
      do {
        pauVar73 = pauVar73 + -1;
        root.ptr = puVar78[-1];
        puVar78 = puVar78 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_007af625:
          iVar68 = 3;
        }
        else {
          local_2aa0 = *pauVar73;
          uVar71 = vcmpps_avx512vl(local_2aa0,local_2640,1);
          if ((char)uVar71 == '\0') {
LAB_007af636:
            iVar68 = 2;
          }
          else {
            uVar70 = (undefined4)uVar71;
            iVar68 = 0;
            if ((uint)POPCOUNT(uVar70) <= uVar80) {
              do {
                k = 0;
                for (uVar80 = uVar71; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                local_2b60._0_8_ = k;
                auVar143 = ZEXT1664(auVar143._0_16_);
                auVar155 = ZEXT1664(auVar155._0_16_);
                auVar167 = ZEXT1664(auVar167._0_16_);
                auVar180 = ZEXT1664(auVar180._0_16_);
                auVar190 = ZEXT1664(auVar190._0_16_);
                auVar193 = ZEXT1664(auVar193._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                bVar79 = occluded1(local_2ab0,bvh,root,k,&local_2b81,ray,
                                   (TravRayK<8,_false> *)&local_2840.field_0,context);
                bVar66 = (byte)(1 << (local_2b60._0_4_ & 0x1f));
                if (!bVar79) {
                  bVar66 = 0;
                }
                bVar67 = bVar67 | bVar66;
                uVar71 = uVar71 - 1 & uVar71;
              } while (uVar71 != 0);
              if (bVar67 == 0xff) {
                iVar68 = 3;
              }
              else {
                auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                local_2640._0_4_ =
                     (uint)(bVar67 & 1) * auVar85._0_4_ |
                     (uint)!(bool)(bVar67 & 1) * local_2640._0_4_;
                bVar79 = (bool)(bVar67 >> 1 & 1);
                local_2640._4_4_ = (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_2640._4_4_;
                bVar79 = (bool)(bVar67 >> 2 & 1);
                local_2640._8_4_ = (uint)bVar79 * auVar85._8_4_ | (uint)!bVar79 * local_2640._8_4_;
                bVar79 = (bool)(bVar67 >> 3 & 1);
                local_2640._12_4_ =
                     (uint)bVar79 * auVar85._12_4_ | (uint)!bVar79 * local_2640._12_4_;
                bVar79 = (bool)(bVar67 >> 4 & 1);
                local_2640._16_4_ =
                     (uint)bVar79 * auVar85._16_4_ | (uint)!bVar79 * local_2640._16_4_;
                bVar79 = (bool)(bVar67 >> 5 & 1);
                local_2640._20_4_ =
                     (uint)bVar79 * auVar85._20_4_ | (uint)!bVar79 * local_2640._20_4_;
                bVar79 = (bool)(bVar67 >> 6 & 1);
                local_2640._24_4_ =
                     (uint)bVar79 * auVar85._24_4_ | (uint)!bVar79 * local_2640._24_4_;
                local_2640._28_4_ =
                     (uint)(bVar67 >> 7) * auVar85._28_4_ |
                     (uint)!(bool)(bVar67 >> 7) * local_2640._28_4_;
                iVar68 = 2;
              }
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar210 = ZEXT3264(auVar85);
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar211 = ZEXT3264(auVar85);
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar212 = ZEXT3264(auVar85);
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar213 = ZEXT3264(auVar85);
              auVar82 = vxorps_avx512vl(auVar214._0_16_,auVar214._0_16_);
              auVar214 = ZEXT1664(auVar82);
              auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar215 = ZEXT3264(auVar85);
            }
            auVar207 = ZEXT3264(local_2aa0);
            uVar80 = local_2aa8;
            if ((uint)local_2aa8 < (uint)POPCOUNT(uVar70)) {
              do {
                auVar85 = auVar207._0_32_;
                uVar77 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_007af625;
                  uVar18 = vcmpps_avx512vl(auVar85,local_2640,9);
                  if ((char)uVar18 != '\0') {
                    local_2a70 = (ulong)(uVar77 & 0xf) - 8;
                    bVar66 = bVar67;
                    if (local_2a70 != 0) {
                      bVar66 = ~bVar67;
                      uVar80 = 0;
                      do {
                        local_2a68 = uVar80;
                        lVar76 = uVar80 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        local_2b80 = 0;
                        local_2b78 = (ulong)bVar66;
                        for (uVar80 = local_2b78; (uVar80 & 1) == 0;
                            uVar80 = uVar80 >> 1 | 0x8000000000000000) {
                          local_2b80 = local_2b80 + 1;
                        }
                        uVar80 = 0;
                        bVar75 = bVar66;
                        while( true ) {
                          auVar209 = auVar207._28_36_;
                          auVar132 = auVar193._28_36_;
                          auVar124 = auVar190._28_36_;
                          auVar206 = in_ZMM14._28_36_;
                          auVar82 = auVar214._0_16_;
                          if (*(int *)(lVar76 + 0x50 + uVar80 * 4) == -1) break;
                          pGVar3 = (context->scene->geometries).items
                                   [*(uint *)(lVar76 + 0x40 + uVar80 * 4)].ptr;
                          fVar195 = (pGVar3->time_range).lower;
                          auVar90._4_4_ = fVar195;
                          auVar90._0_4_ = fVar195;
                          auVar90._8_4_ = fVar195;
                          auVar90._12_4_ = fVar195;
                          auVar90._16_4_ = fVar195;
                          auVar90._20_4_ = fVar195;
                          auVar90._24_4_ = fVar195;
                          auVar90._28_4_ = fVar195;
                          fVar110 = pGVar3->fnumTimeSegments;
                          auVar83._4_4_ = fVar110;
                          auVar83._0_4_ = fVar110;
                          auVar83._8_4_ = fVar110;
                          auVar83._12_4_ = fVar110;
                          auVar88 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar90);
                          fVar195 = (pGVar3->time_range).upper - fVar195;
                          auVar91._4_4_ = fVar195;
                          auVar91._0_4_ = fVar195;
                          auVar91._8_4_ = fVar195;
                          auVar91._12_4_ = fVar195;
                          auVar91._16_4_ = fVar195;
                          auVar91._20_4_ = fVar195;
                          auVar91._24_4_ = fVar195;
                          auVar91._28_4_ = fVar195;
                          auVar85 = vdivps_avx(auVar88,auVar91);
                          auVar87._4_4_ = fVar110 * auVar85._4_4_;
                          auVar87._0_4_ = fVar110 * auVar85._0_4_;
                          auVar87._8_4_ = fVar110 * auVar85._8_4_;
                          auVar87._12_4_ = fVar110 * auVar85._12_4_;
                          auVar87._16_4_ = fVar110 * auVar85._16_4_;
                          auVar87._20_4_ = fVar110 * auVar85._20_4_;
                          auVar87._24_4_ = fVar110 * auVar85._24_4_;
                          auVar87._28_4_ = auVar85._28_4_;
                          auVar85 = vroundps_avx(auVar87,1);
                          auVar83 = vaddss_avx512f(auVar83,SUB6416(ZEXT464(0xbf800000),0));
                          auVar92._0_4_ = auVar83._0_4_;
                          auVar92._4_4_ = auVar92._0_4_;
                          auVar92._8_4_ = auVar92._0_4_;
                          auVar92._12_4_ = auVar92._0_4_;
                          auVar92._16_4_ = auVar92._0_4_;
                          auVar92._20_4_ = auVar92._0_4_;
                          auVar92._24_4_ = auVar92._0_4_;
                          auVar92._28_4_ = auVar92._0_4_;
                          auVar85 = vminps_avx(auVar85,auVar92);
                          auVar86 = auVar214._0_32_;
                          auVar85 = vmaxps_avx512vl(auVar85,auVar86);
                          local_2b40 = vcvtps2dq_avx(auVar85);
                          fVar195 = local_2b40._28_4_;
                          auVar85 = vsubps_avx(auVar87,auVar85);
                          auVar89 = vpbroadcastd_avx512vl();
                          uVar18 = vpcmpeqd_avx512vl(auVar89,local_2b40);
                          if ((byte)((byte)uVar18 | ~bVar66) == 0xff) {
                            lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives +
                                             (long)*(int *)(local_2b40 + local_2b80 * 4) * 0x38);
                            lVar5 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 +
                                             (long)*(int *)(local_2b40 + local_2b80 * 4) * 0x38);
                            uVar71 = (ulong)*(uint *)(lVar76 + uVar80 * 4);
                            uVar69 = (ulong)*(uint *)(lVar76 + 0x10 + uVar80 * 4);
                            auVar93 = vsubps_avx512vl(auVar211._0_32_,auVar85);
                            uVar70 = *(undefined4 *)(lVar5 + uVar71 * 4);
                            auVar101._4_4_ = uVar70;
                            auVar101._0_4_ = uVar70;
                            auVar101._8_4_ = uVar70;
                            auVar101._12_4_ = uVar70;
                            auVar101._16_4_ = uVar70;
                            auVar101._20_4_ = uVar70;
                            auVar101._24_4_ = uVar70;
                            auVar101._28_4_ = uVar70;
                            auVar88 = vmulps_avx512vl(auVar85,auVar101);
                            uVar70 = *(undefined4 *)(lVar5 + 4 + uVar71 * 4);
                            auVar102._4_4_ = uVar70;
                            auVar102._0_4_ = uVar70;
                            auVar102._8_4_ = uVar70;
                            auVar102._12_4_ = uVar70;
                            auVar102._16_4_ = uVar70;
                            auVar102._20_4_ = uVar70;
                            auVar102._24_4_ = uVar70;
                            auVar102._28_4_ = uVar70;
                            auVar89 = vmulps_avx512vl(auVar85,auVar102);
                            uVar70 = *(undefined4 *)(lVar5 + 8 + uVar71 * 4);
                            auVar103._4_4_ = uVar70;
                            auVar103._0_4_ = uVar70;
                            auVar103._8_4_ = uVar70;
                            auVar103._12_4_ = uVar70;
                            auVar103._16_4_ = uVar70;
                            auVar103._20_4_ = uVar70;
                            auVar103._24_4_ = uVar70;
                            auVar103._28_4_ = uVar70;
                            auVar87 = vmulps_avx512vl(auVar85,auVar103);
                            uVar70 = *(undefined4 *)(lVar4 + uVar71 * 4);
                            auVar104._4_4_ = uVar70;
                            auVar104._0_4_ = uVar70;
                            auVar104._8_4_ = uVar70;
                            auVar104._12_4_ = uVar70;
                            auVar104._16_4_ = uVar70;
                            auVar104._20_4_ = uVar70;
                            auVar104._24_4_ = uVar70;
                            auVar104._28_4_ = uVar70;
                            auVar94 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar104);
                            uVar70 = *(undefined4 *)(lVar4 + 4 + uVar71 * 4);
                            auVar105._4_4_ = uVar70;
                            auVar105._0_4_ = uVar70;
                            auVar105._8_4_ = uVar70;
                            auVar105._12_4_ = uVar70;
                            auVar105._16_4_ = uVar70;
                            auVar105._20_4_ = uVar70;
                            auVar105._24_4_ = uVar70;
                            auVar105._28_4_ = uVar70;
                            auVar95 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar105);
                            uVar70 = *(undefined4 *)(lVar4 + 8 + uVar71 * 4);
                            auVar106._4_4_ = uVar70;
                            auVar106._0_4_ = uVar70;
                            auVar106._8_4_ = uVar70;
                            auVar106._12_4_ = uVar70;
                            auVar106._16_4_ = uVar70;
                            auVar106._20_4_ = uVar70;
                            auVar106._24_4_ = uVar70;
                            auVar106._28_4_ = uVar70;
                            auVar96 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar106);
                            uVar70 = *(undefined4 *)(lVar5 + uVar69 * 4);
                            auVar107._4_4_ = uVar70;
                            auVar107._0_4_ = uVar70;
                            auVar107._8_4_ = uVar70;
                            auVar107._12_4_ = uVar70;
                            auVar107._16_4_ = uVar70;
                            auVar107._20_4_ = uVar70;
                            auVar107._24_4_ = uVar70;
                            auVar107._28_4_ = uVar70;
                            auVar88 = vmulps_avx512vl(auVar85,auVar107);
                            uVar70 = *(undefined4 *)(lVar5 + 4 + uVar69 * 4);
                            auVar108._4_4_ = uVar70;
                            auVar108._0_4_ = uVar70;
                            auVar108._8_4_ = uVar70;
                            auVar108._12_4_ = uVar70;
                            auVar108._16_4_ = uVar70;
                            auVar108._20_4_ = uVar70;
                            auVar108._24_4_ = uVar70;
                            auVar108._28_4_ = uVar70;
                            auVar89 = vmulps_avx512vl(auVar85,auVar108);
                            uVar70 = *(undefined4 *)(lVar5 + 8 + uVar69 * 4);
                            auVar30._4_4_ = uVar70;
                            auVar30._0_4_ = uVar70;
                            auVar30._8_4_ = uVar70;
                            auVar30._12_4_ = uVar70;
                            auVar30._16_4_ = uVar70;
                            auVar30._20_4_ = uVar70;
                            auVar30._24_4_ = uVar70;
                            auVar30._28_4_ = uVar70;
                            auVar87 = vmulps_avx512vl(auVar85,auVar30);
                            uVar70 = *(undefined4 *)(lVar4 + uVar69 * 4);
                            auVar31._4_4_ = uVar70;
                            auVar31._0_4_ = uVar70;
                            auVar31._8_4_ = uVar70;
                            auVar31._12_4_ = uVar70;
                            auVar31._16_4_ = uVar70;
                            auVar31._20_4_ = uVar70;
                            auVar31._24_4_ = uVar70;
                            auVar31._28_4_ = uVar70;
                            auVar97 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar31);
                            uVar70 = *(undefined4 *)(lVar4 + 4 + uVar69 * 4);
                            auVar32._4_4_ = uVar70;
                            auVar32._0_4_ = uVar70;
                            auVar32._8_4_ = uVar70;
                            auVar32._12_4_ = uVar70;
                            auVar32._16_4_ = uVar70;
                            auVar32._20_4_ = uVar70;
                            auVar32._24_4_ = uVar70;
                            auVar32._28_4_ = uVar70;
                            auVar98 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar32);
                            uVar70 = *(undefined4 *)(lVar4 + 8 + uVar69 * 4);
                            auVar33._4_4_ = uVar70;
                            auVar33._0_4_ = uVar70;
                            auVar33._8_4_ = uVar70;
                            auVar33._12_4_ = uVar70;
                            auVar33._16_4_ = uVar70;
                            auVar33._20_4_ = uVar70;
                            auVar33._24_4_ = uVar70;
                            auVar33._28_4_ = uVar70;
                            auVar99 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar33);
                            uVar71 = (ulong)*(uint *)(lVar76 + 0x20 + uVar80 * 4);
                            uVar70 = *(undefined4 *)(lVar5 + uVar71 * 4);
                            auVar34._4_4_ = uVar70;
                            auVar34._0_4_ = uVar70;
                            auVar34._8_4_ = uVar70;
                            auVar34._12_4_ = uVar70;
                            auVar34._16_4_ = uVar70;
                            auVar34._20_4_ = uVar70;
                            auVar34._24_4_ = uVar70;
                            auVar34._28_4_ = uVar70;
                            auVar88 = vmulps_avx512vl(auVar85,auVar34);
                            uVar70 = *(undefined4 *)(lVar5 + 4 + uVar71 * 4);
                            auVar35._4_4_ = uVar70;
                            auVar35._0_4_ = uVar70;
                            auVar35._8_4_ = uVar70;
                            auVar35._12_4_ = uVar70;
                            auVar35._16_4_ = uVar70;
                            auVar35._20_4_ = uVar70;
                            auVar35._24_4_ = uVar70;
                            auVar35._28_4_ = uVar70;
                            auVar89 = vmulps_avx512vl(auVar85,auVar35);
                            uVar70 = *(undefined4 *)(lVar5 + 8 + uVar71 * 4);
                            auVar36._4_4_ = uVar70;
                            auVar36._0_4_ = uVar70;
                            auVar36._8_4_ = uVar70;
                            auVar36._12_4_ = uVar70;
                            auVar36._16_4_ = uVar70;
                            auVar36._20_4_ = uVar70;
                            auVar36._24_4_ = uVar70;
                            auVar36._28_4_ = uVar70;
                            auVar87 = vmulps_avx512vl(auVar85,auVar36);
                            uVar70 = *(undefined4 *)(lVar4 + uVar71 * 4);
                            auVar37._4_4_ = uVar70;
                            auVar37._0_4_ = uVar70;
                            auVar37._8_4_ = uVar70;
                            auVar37._12_4_ = uVar70;
                            auVar37._16_4_ = uVar70;
                            auVar37._20_4_ = uVar70;
                            auVar37._24_4_ = uVar70;
                            auVar37._28_4_ = uVar70;
                            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar37);
                            uVar70 = *(undefined4 *)(lVar4 + 4 + uVar71 * 4);
                            auVar38._4_4_ = uVar70;
                            auVar38._0_4_ = uVar70;
                            auVar38._8_4_ = uVar70;
                            auVar38._12_4_ = uVar70;
                            auVar38._16_4_ = uVar70;
                            auVar38._20_4_ = uVar70;
                            auVar38._24_4_ = uVar70;
                            auVar38._28_4_ = uVar70;
                            auVar90 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar38);
                            uVar70 = *(undefined4 *)(lVar4 + 8 + uVar71 * 4);
                            auVar39._4_4_ = uVar70;
                            auVar39._0_4_ = uVar70;
                            auVar39._8_4_ = uVar70;
                            auVar39._12_4_ = uVar70;
                            auVar39._16_4_ = uVar70;
                            auVar39._20_4_ = uVar70;
                            auVar39._24_4_ = uVar70;
                            auVar39._28_4_ = uVar70;
                            auVar91 = vfmadd231ps_avx512vl(auVar87,auVar93,auVar39);
                            uVar71 = (ulong)*(uint *)(lVar76 + 0x30 + uVar80 * 4);
                            uVar70 = *(undefined4 *)(lVar5 + uVar71 * 4);
                            auVar40._4_4_ = uVar70;
                            auVar40._0_4_ = uVar70;
                            auVar40._8_4_ = uVar70;
                            auVar40._12_4_ = uVar70;
                            auVar40._16_4_ = uVar70;
                            auVar40._20_4_ = uVar70;
                            auVar40._24_4_ = uVar70;
                            auVar40._28_4_ = uVar70;
                            auVar89 = vmulps_avx512vl(auVar85,auVar40);
                            uVar70 = *(undefined4 *)(lVar5 + 4 + uVar71 * 4);
                            auVar41._4_4_ = uVar70;
                            auVar41._0_4_ = uVar70;
                            auVar41._8_4_ = uVar70;
                            auVar41._12_4_ = uVar70;
                            auVar41._16_4_ = uVar70;
                            auVar41._20_4_ = uVar70;
                            auVar41._24_4_ = uVar70;
                            auVar41._28_4_ = uVar70;
                            auVar92 = vmulps_avx512vl(auVar85,auVar41);
                            uVar70 = *(undefined4 *)(lVar5 + 8 + uVar71 * 4);
                            auVar42._4_4_ = uVar70;
                            auVar42._0_4_ = uVar70;
                            auVar42._8_4_ = uVar70;
                            auVar42._12_4_ = uVar70;
                            auVar42._16_4_ = uVar70;
                            auVar42._20_4_ = uVar70;
                            auVar42._24_4_ = uVar70;
                            auVar42._28_4_ = uVar70;
                            auVar85 = vmulps_avx512vl(auVar85,auVar42);
                            uVar70 = *(undefined4 *)(lVar4 + uVar71 * 4);
                            auVar43._4_4_ = uVar70;
                            auVar43._0_4_ = uVar70;
                            auVar43._8_4_ = uVar70;
                            auVar43._12_4_ = uVar70;
                            auVar43._16_4_ = uVar70;
                            auVar43._20_4_ = uVar70;
                            auVar43._24_4_ = uVar70;
                            auVar43._28_4_ = uVar70;
                            auVar87 = vfmadd231ps_avx512vl(auVar89,auVar93,auVar43);
                            uVar70 = *(undefined4 *)(lVar4 + 4 + uVar71 * 4);
                            auVar44._4_4_ = uVar70;
                            auVar44._0_4_ = uVar70;
                            auVar44._8_4_ = uVar70;
                            auVar44._12_4_ = uVar70;
                            auVar44._16_4_ = uVar70;
                            auVar44._20_4_ = uVar70;
                            auVar44._24_4_ = uVar70;
                            auVar44._28_4_ = uVar70;
                            local_2b60 = vfmadd231ps_avx512vl(auVar92,auVar93,auVar44);
                            uVar70 = *(undefined4 *)(lVar4 + 8 + uVar71 * 4);
                            auVar45._4_4_ = uVar70;
                            auVar45._0_4_ = uVar70;
                            auVar45._8_4_ = uVar70;
                            auVar45._12_4_ = uVar70;
                            auVar45._16_4_ = uVar70;
                            auVar45._20_4_ = uVar70;
                            auVar45._24_4_ = uVar70;
                            auVar45._28_4_ = uVar70;
                            local_2aa0 = vfmadd231ps_avx512vl(auVar85,auVar93,auVar45);
                          }
                          else {
                            auVar64 = local_2b20;
                            pRVar65 = local_2b00;
                            if (bVar66 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar74 = (ulong)*(uint *)(lVar76 + uVar80 * 4);
                              uVar69 = local_2b78;
                              uVar71 = local_2b80;
                              do {
                                auVar83 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + (long)*(int *)(local_2b40 + uVar71 * 4
                                                                            ) * 0x38) + uVar74 * 4);
                                auVar84 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + 0x38 +
                                                     (long)*(int *)(local_2b40 + uVar71 * 4) * 0x38)
                                           + uVar74 * 4);
                                fVar195 = 0.0;
                                *(int *)(local_2980 + uVar71 * 4) = auVar83._0_4_;
                                uVar70 = vextractps_avx(auVar83,1);
                                *(undefined4 *)(local_2960 + uVar71 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar83,2);
                                *(undefined4 *)(local_2940 + uVar71 * 4) = uVar70;
                                *(int *)(local_2b20 + uVar71 * 4) = auVar84._0_4_;
                                uVar70 = vextractps_avx(auVar84,1);
                                *(undefined4 *)((long)&local_2b00 + uVar71 * 4) = uVar70;
                                fVar110 = (float)vextractps_avx(auVar84,2);
                                local_2ae0[uVar71] = fVar110;
                                uVar69 = uVar69 ^ 1L << (uVar71 & 0x3f);
                                uVar71 = 0;
                                for (uVar81 = uVar69; (uVar81 & 1) == 0;
                                    uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                                  uVar71 = uVar71 + 1;
                                }
                                auVar64 = local_2b20;
                                pRVar65 = local_2b00;
                              } while (uVar69 != 0);
                            }
                            local_2b00._4_4_ = (float)((ulong)pRVar65 >> 0x20);
                            local_2b00._0_4_ = SUB84(pRVar65,0);
                            local_2b20._4_4_ = (undefined4)((ulong)auVar64 >> 0x20);
                            local_2b20._0_4_ = SUB84(auVar64,0);
                            auVar89 = vsubps_avx512vl(auVar211._0_32_,auVar85);
                            fVar117 = auVar89._0_4_;
                            fVar125 = fVar117 * (float)local_2980._0_4_;
                            fVar118 = auVar89._4_4_;
                            fVar126 = fVar118 * (float)local_2980._4_4_;
                            fVar119 = auVar89._8_4_;
                            fVar127 = fVar119 * fStack_2978;
                            fVar120 = auVar89._12_4_;
                            fVar128 = fVar120 * fStack_2974;
                            fVar121 = auVar89._16_4_;
                            fVar129 = fVar121 * fStack_2970;
                            fVar122 = auVar89._20_4_;
                            fVar130 = fVar122 * fStack_296c;
                            fVar123 = auVar89._24_4_;
                            fVar131 = fVar123 * fStack_2968;
                            fVar133 = fVar117 * (float)local_2960._0_4_;
                            fVar134 = fVar118 * (float)local_2960._4_4_;
                            fVar135 = fVar119 * fStack_2958;
                            fVar136 = fVar120 * fStack_2954;
                            fVar137 = fVar121 * fStack_2950;
                            fVar138 = fVar122 * fStack_294c;
                            fVar139 = fVar123 * fStack_2948;
                            fVar140 = fVar117 * (float)local_2940._0_4_;
                            fVar144 = fVar118 * (float)local_2940._4_4_;
                            fVar145 = fVar119 * fStack_2938;
                            fVar146 = fVar120 * fStack_2934;
                            fVar147 = fVar121 * fStack_2930;
                            fVar148 = fVar122 * fStack_292c;
                            fVar149 = fVar123 * fStack_2928;
                            fVar110 = auVar85._0_4_;
                            fVar150 = fVar110 * (float)local_2b20._0_4_;
                            fVar111 = auVar85._4_4_;
                            fVar156 = fVar111 * (float)local_2b20._4_4_;
                            fVar112 = auVar85._8_4_;
                            fVar157 = fVar112 * fStack_2b18;
                            fVar113 = auVar85._12_4_;
                            fVar158 = fVar113 * fStack_2b14;
                            fVar114 = auVar85._16_4_;
                            fVar159 = fVar114 * fStack_2b10;
                            fVar115 = auVar85._20_4_;
                            fVar160 = fVar115 * fStack_2b0c;
                            fVar116 = auVar85._24_4_;
                            fVar161 = fVar116 * (float)uStack_2b08;
                            fVar162 = fVar110 * (float)local_2b00;
                            fVar168 = fVar111 * local_2b00._4_4_;
                            fVar169 = fVar112 * fStack_2af8;
                            fVar170 = fVar113 * fStack_2af4;
                            fVar171 = fVar114 * fStack_2af0;
                            fVar172 = fVar115 * fStack_2aec;
                            fVar173 = fVar116 * fStack_2ae8;
                            fVar174 = fVar110 * local_2ae0[0];
                            fVar181 = fVar111 * local_2ae0[1];
                            fVar182 = fVar112 * local_2ae0[2];
                            fVar183 = fVar113 * local_2ae0[3];
                            fVar184 = fVar114 * fStack_2ad0;
                            fVar185 = fVar115 * fStack_2acc;
                            fVar186 = fVar116 * fStack_2ac8;
                            if (bVar66 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar74 = (ulong)*(uint *)(lVar76 + 0x10 + uVar80 * 4);
                              uVar69 = local_2b78;
                              uVar71 = local_2b80;
                              local_2b20 = auVar64;
                              local_2b00 = pRVar65;
                              do {
                                auVar83 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + (long)*(int *)(local_2b40 + uVar71 * 4
                                                                            ) * 0x38) + uVar74 * 4);
                                auVar124 = (undefined1  [36])0x0;
                                auVar84 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + 0x38 +
                                                     (long)*(int *)(local_2b40 + uVar71 * 4) * 0x38)
                                           + uVar74 * 4);
                                auVar132 = (undefined1  [36])0x0;
                                *(int *)(local_2980 + uVar71 * 4) = auVar83._0_4_;
                                uVar70 = vextractps_avx(auVar83,1);
                                *(undefined4 *)(local_2960 + uVar71 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar83,2);
                                *(undefined4 *)(local_2940 + uVar71 * 4) = uVar70;
                                *(int *)(local_2b20 + uVar71 * 4) = auVar84._0_4_;
                                uVar70 = vextractps_avx(auVar84,1);
                                *(undefined4 *)((long)&local_2b00 + uVar71 * 4) = uVar70;
                                fVar2 = (float)vextractps_avx(auVar84,2);
                                local_2ae0[uVar71] = fVar2;
                                uVar69 = uVar69 ^ 1L << (uVar71 & 0x3f);
                                uVar71 = 0;
                                for (uVar81 = uVar69; (uVar81 & 1) == 0;
                                    uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                                  uVar71 = uVar71 + 1;
                                }
                                auVar64 = local_2b20;
                                pRVar65 = local_2b00;
                              } while (uVar69 != 0);
                            }
                            local_2b00._4_4_ = (float)((ulong)pRVar65 >> 0x20);
                            local_2b00._0_4_ = SUB84(pRVar65,0);
                            local_2b20._4_4_ = (undefined4)((ulong)auVar64 >> 0x20);
                            local_2b20._0_4_ = SUB84(auVar64,0);
                            auVar190._0_4_ = fVar117 * (float)local_2980._0_4_;
                            auVar190._4_4_ = fVar118 * (float)local_2980._4_4_;
                            auVar190._8_4_ = fVar119 * fStack_2978;
                            auVar190._12_4_ = fVar120 * fStack_2974;
                            auVar190._16_4_ = fVar121 * fStack_2970;
                            auVar190._20_4_ = fVar122 * fStack_296c;
                            auVar190._24_4_ = fVar123 * fStack_2968;
                            auVar190._28_36_ = auVar124;
                            auVar193._0_4_ = fVar117 * (float)local_2960._0_4_;
                            auVar193._4_4_ = fVar118 * (float)local_2960._4_4_;
                            auVar193._8_4_ = fVar119 * fStack_2958;
                            auVar193._12_4_ = fVar120 * fStack_2954;
                            auVar193._16_4_ = fVar121 * fStack_2950;
                            auVar193._20_4_ = fVar122 * fStack_294c;
                            auVar193._24_4_ = fVar123 * fStack_2948;
                            auVar193._28_36_ = auVar132;
                            auVar207._0_4_ = fVar117 * (float)local_2940._0_4_;
                            auVar207._4_4_ = fVar118 * (float)local_2940._4_4_;
                            auVar207._8_4_ = fVar119 * fStack_2938;
                            auVar207._12_4_ = fVar120 * fStack_2934;
                            auVar207._16_4_ = fVar121 * fStack_2930;
                            auVar207._20_4_ = fVar122 * fStack_292c;
                            auVar207._28_36_ = in_ZMM10._28_36_;
                            auVar207._24_4_ = fVar123 * fStack_2928;
                            auVar194._0_4_ = fVar110 * (float)local_2b20._0_4_;
                            auVar194._4_4_ = fVar111 * (float)local_2b20._4_4_;
                            auVar194._8_4_ = fVar112 * fStack_2b18;
                            auVar194._12_4_ = fVar113 * fStack_2b14;
                            auVar194._16_4_ = fVar114 * fStack_2b10;
                            auVar194._20_4_ = fVar115 * fStack_2b0c;
                            auVar194._28_36_ = in_ZMM11._28_36_;
                            auVar194._24_4_ = fVar116 * (float)uStack_2b08;
                            auVar197._0_4_ = fVar110 * (float)local_2b00;
                            auVar197._4_4_ = fVar111 * local_2b00._4_4_;
                            auVar197._8_4_ = fVar112 * fStack_2af8;
                            auVar197._12_4_ = fVar113 * fStack_2af4;
                            auVar197._16_4_ = fVar114 * fStack_2af0;
                            auVar197._20_4_ = fVar115 * fStack_2aec;
                            auVar197._28_36_ = in_ZMM12._28_36_;
                            auVar197._24_4_ = fVar116 * fStack_2ae8;
                            auVar200._0_4_ = fVar110 * local_2ae0[0];
                            auVar200._4_4_ = fVar111 * local_2ae0[1];
                            auVar200._8_4_ = fVar112 * local_2ae0[2];
                            auVar200._12_4_ = fVar113 * local_2ae0[3];
                            auVar200._16_4_ = fVar114 * fStack_2ad0;
                            auVar200._20_4_ = fVar115 * fStack_2acc;
                            auVar200._28_36_ = in_ZMM13._28_36_;
                            auVar200._24_4_ = fVar116 * fStack_2ac8;
                            local_2b20 = auVar64;
                            local_2b00 = pRVar65;
                            pRVar1 = uStack_2b08;
                            if (bVar66 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar74 = (ulong)*(uint *)(lVar76 + 0x20 + uVar80 * 4);
                              uVar69 = local_2b78;
                              uVar71 = local_2b80;
                              do {
                                auVar83 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + (long)*(int *)(local_2b40 + uVar71 * 4
                                                                            ) * 0x38) + uVar74 * 4);
                                auVar206 = (undefined1  [36])0x0;
                                auVar84 = *(undefined1 (*) [16])
                                           (*(long *)(lVar4 + 0x38 +
                                                     (long)*(int *)(local_2b40 + uVar71 * 4) * 0x38)
                                           + uVar74 * 4);
                                auVar209 = (undefined1  [36])0x0;
                                *(int *)(local_2980 + uVar71 * 4) = auVar83._0_4_;
                                uVar70 = vextractps_avx(auVar83,1);
                                *(undefined4 *)(local_2960 + uVar71 * 4) = uVar70;
                                uVar70 = vextractps_avx(auVar83,2);
                                *(undefined4 *)(local_2940 + uVar71 * 4) = uVar70;
                                *(int *)(local_2b20 + uVar71 * 4) = auVar84._0_4_;
                                uVar70 = vextractps_avx(auVar84,1);
                                *(undefined4 *)((long)&local_2b00 + uVar71 * 4) = uVar70;
                                fVar2 = (float)vextractps_avx(auVar84,2);
                                local_2ae0[uVar71] = fVar2;
                                uVar69 = uVar69 ^ 1L << (uVar71 & 0x3f);
                                uVar71 = 0;
                                for (uVar81 = uVar69; (uVar81 & 1) == 0;
                                    uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                                  uVar71 = uVar71 + 1;
                                }
                                pRVar1 = uStack_2b08;
                              } while (uVar69 != 0);
                            }
                            uStack_2b08._4_4_ = (undefined4)((ulong)pRVar1 >> 0x20);
                            uStack_2b08._0_4_ = SUB84(pRVar1,0);
                            auVar208._0_4_ = fVar117 * (float)local_2980._0_4_;
                            auVar208._4_4_ = fVar118 * (float)local_2980._4_4_;
                            auVar208._8_4_ = fVar119 * fStack_2978;
                            auVar208._12_4_ = fVar120 * fStack_2974;
                            auVar208._16_4_ = fVar121 * fStack_2970;
                            auVar208._20_4_ = fVar122 * fStack_296c;
                            auVar208._24_4_ = fVar123 * fStack_2968;
                            auVar208._28_36_ = auVar209;
                            auVar87 = vmulps_avx512vl(auVar89,_local_2960);
                            auVar205._0_4_ = fVar117 * (float)local_2940._0_4_;
                            auVar205._4_4_ = fVar118 * (float)local_2940._4_4_;
                            auVar205._8_4_ = fVar119 * fStack_2938;
                            auVar205._12_4_ = fVar120 * fStack_2934;
                            auVar205._16_4_ = fVar121 * fStack_2930;
                            auVar205._20_4_ = fVar122 * fStack_292c;
                            auVar205._24_4_ = fVar123 * fStack_2928;
                            auVar205._28_36_ = auVar206;
                            auVar206 = ZEXT436(auVar206._0_4_);
                            auVar97._8_4_ = fStack_2b18;
                            auVar97._0_8_ = local_2b20;
                            auVar97._12_4_ = fStack_2b14;
                            auVar97._16_4_ = fStack_2b10;
                            auVar97._20_4_ = fStack_2b0c;
                            auVar97._24_4_ = (float)uStack_2b08;
                            auVar97._28_4_ = uStack_2b08._4_4_;
                            auVar90 = vmulps_avx512vl(auVar85,auVar97);
                            auVar98._8_4_ = fStack_2af8;
                            auVar98._0_8_ = local_2b00;
                            auVar98._12_4_ = fStack_2af4;
                            auVar98._16_4_ = fStack_2af0;
                            auVar98._20_4_ = fStack_2aec;
                            auVar98._24_4_ = fStack_2ae8;
                            auVar98._28_4_ = uStack_2ae4;
                            auVar91 = vmulps_avx512vl(auVar85,auVar98);
                            auVar99._4_4_ = local_2ae0[1];
                            auVar99._0_4_ = local_2ae0[0];
                            auVar99._8_4_ = local_2ae0[2];
                            auVar99._12_4_ = local_2ae0[3];
                            auVar99._16_4_ = fStack_2ad0;
                            auVar99._20_4_ = fStack_2acc;
                            auVar99._24_4_ = fStack_2ac8;
                            auVar99._28_4_ = uStack_2ac4;
                            auVar92 = vmulps_avx512vl(auVar85,auVar99);
                            auVar64 = local_2b20;
                            pRVar65 = local_2b00;
                            uStack_2b08 = pRVar1;
                            if (bVar66 != 0) {
                              lVar4 = *(long *)&pGVar3[2].numPrimitives;
                              uVar74 = (ulong)*(uint *)(lVar76 + 0x30 + uVar80 * 4);
                              uVar69 = local_2b78;
                              uVar71 = local_2b80;
                              do {
                                auVar83 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar4 + (long)*(int *)(
                                                  local_2b40 + uVar71 * 4) * 0x38) + uVar74 * 4));
                                auVar84 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                              (*(long *)(lVar4 + 0x38 +
                                                                        (long)*(int *)(local_2b40 +
                                                                                      uVar71 * 4) *
                                                                        0x38) + uVar74 * 4));
                                *(int *)(local_2980 + uVar71 * 4) = auVar83._0_4_;
                                uVar70 = vextractps_avx512f(auVar83,1);
                                *(undefined4 *)(local_2960 + uVar71 * 4) = uVar70;
                                uVar70 = vextractps_avx512f(auVar83,2);
                                *(undefined4 *)(local_2940 + uVar71 * 4) = uVar70;
                                *(int *)(local_2b20 + uVar71 * 4) = auVar84._0_4_;
                                uVar70 = vextractps_avx512f(auVar84,1);
                                *(undefined4 *)((long)&local_2b00 + uVar71 * 4) = uVar70;
                                fVar2 = (float)vextractps_avx512f(auVar84,2);
                                local_2ae0[uVar71] = fVar2;
                                uVar69 = uVar69 ^ 1L << (uVar71 & 0x3f);
                                uVar71 = 0;
                                for (uVar81 = uVar69; (uVar81 & 1) == 0;
                                    uVar81 = uVar81 >> 1 | 0x8000000000000000) {
                                  uVar71 = uVar71 + 1;
                                }
                                auVar64 = local_2b20;
                                pRVar65 = local_2b00;
                              } while (uVar69 != 0);
                            }
                            local_2b00._4_4_ = (float)((ulong)pRVar65 >> 0x20);
                            local_2b00._0_4_ = SUB84(pRVar65,0);
                            local_2b20._4_4_ = (undefined4)((ulong)auVar64 >> 0x20);
                            local_2b20._0_4_ = SUB84(auVar64,0);
                            auVar94._0_4_ = fVar125 + fVar150;
                            auVar94._4_4_ = fVar126 + fVar156;
                            auVar94._8_4_ = fVar127 + fVar157;
                            auVar94._12_4_ = fVar128 + fVar158;
                            auVar94._16_4_ = fVar129 + fVar159;
                            auVar94._20_4_ = fVar130 + fVar160;
                            auVar94._24_4_ = fVar131 + fVar161;
                            auVar94._28_4_ = fVar195 + auVar155._28_4_;
                            auVar95._0_4_ = fVar133 + fVar162;
                            auVar95._4_4_ = fVar134 + fVar168;
                            auVar95._8_4_ = fVar135 + fVar169;
                            auVar95._12_4_ = fVar136 + fVar170;
                            auVar95._16_4_ = fVar137 + fVar171;
                            auVar95._20_4_ = fVar138 + fVar172;
                            auVar95._24_4_ = fVar139 + fVar173;
                            auVar95._28_4_ = auVar88._28_4_ + auVar167._28_4_;
                            auVar96._0_4_ = fVar140 + fVar174;
                            auVar96._4_4_ = fVar144 + fVar181;
                            auVar96._8_4_ = fVar145 + fVar182;
                            auVar96._12_4_ = fVar146 + fVar183;
                            auVar96._16_4_ = fVar147 + fVar184;
                            auVar96._20_4_ = fVar148 + fVar185;
                            auVar96._24_4_ = fVar149 + fVar186;
                            auVar96._28_4_ = auVar143._28_4_ + auVar180._28_4_;
                            auVar97 = vaddps_avx512vl(auVar190._0_32_,auVar194._0_32_);
                            auVar98 = vaddps_avx512vl(auVar193._0_32_,auVar197._0_32_);
                            auVar99 = vaddps_avx512vl(auVar207._0_32_,auVar200._0_32_);
                            auVar88 = vaddps_avx512vl(auVar208._0_32_,auVar90);
                            auVar90 = vaddps_avx512vl(auVar87,auVar91);
                            auVar15._4_4_ = fVar118 * (float)local_2980._4_4_;
                            auVar15._0_4_ = fVar117 * (float)local_2980._0_4_;
                            auVar15._8_4_ = fVar119 * fStack_2978;
                            auVar15._12_4_ = fVar120 * fStack_2974;
                            auVar15._16_4_ = fVar121 * fStack_2970;
                            auVar15._20_4_ = fVar122 * fStack_296c;
                            auVar15._24_4_ = fVar123 * fStack_2968;
                            auVar15._28_4_ = fVar195;
                            auVar91 = vaddps_avx512vl(auVar205._0_32_,auVar92);
                            auVar93._4_4_ = fVar118 * (float)local_2940._4_4_;
                            auVar93._0_4_ = fVar117 * (float)local_2940._0_4_;
                            auVar93._8_4_ = fVar119 * fStack_2938;
                            auVar93._12_4_ = fVar120 * fStack_2934;
                            auVar93._16_4_ = fVar121 * fStack_2930;
                            auVar93._20_4_ = fVar122 * fStack_292c;
                            auVar93._24_4_ = fVar123 * fStack_2928;
                            auVar93._28_4_ = auVar89._28_4_;
                            auVar100._4_4_ = fVar111 * (float)local_2b20._4_4_;
                            auVar100._0_4_ = fVar110 * (float)local_2b20._0_4_;
                            auVar100._8_4_ = fVar112 * fStack_2b18;
                            auVar100._12_4_ = fVar113 * fStack_2b14;
                            auVar100._16_4_ = fVar114 * fStack_2b10;
                            auVar100._20_4_ = fVar115 * fStack_2b0c;
                            auVar100._24_4_ = fVar116 * (float)uStack_2b08;
                            auVar100._28_4_ = auVar180._28_4_;
                            auVar87 = vaddps_avx512vl(auVar15,auVar100);
                            local_2b60._0_4_ =
                                 fVar117 * (float)local_2960._0_4_ + fVar110 * (float)local_2b00;
                            local_2b60._4_4_ =
                                 fVar118 * (float)local_2960._4_4_ + fVar111 * local_2b00._4_4_;
                            local_2b60._8_4_ = fVar119 * fStack_2958 + fVar112 * fStack_2af8;
                            local_2b60._12_4_ = fVar120 * fStack_2954 + fVar113 * fStack_2af4;
                            local_2b60._16_4_ = fVar121 * fStack_2950 + fVar114 * fStack_2af0;
                            local_2b60._20_4_ = fVar122 * fStack_294c + fVar115 * fStack_2aec;
                            local_2b60._24_4_ = fVar123 * fStack_2948 + fVar116 * fStack_2ae8;
                            local_2b60._28_4_ = auVar167._28_4_ + fVar195;
                            local_2aa0._0_4_ =
                                 fVar117 * (float)local_2940._0_4_ + fVar110 * local_2ae0[0];
                            local_2aa0._4_4_ =
                                 fVar118 * (float)local_2940._4_4_ + fVar111 * local_2ae0[1];
                            local_2aa0._8_4_ = fVar119 * fStack_2938 + fVar112 * local_2ae0[2];
                            local_2aa0._12_4_ = fVar120 * fStack_2934 + fVar113 * local_2ae0[3];
                            local_2aa0._16_4_ = fVar121 * fStack_2930 + fVar114 * fStack_2ad0;
                            local_2aa0._20_4_ = fVar122 * fStack_292c + fVar115 * fStack_2acc;
                            local_2aa0._24_4_ = fVar123 * fStack_2928 + fVar116 * fStack_2ac8;
                            local_2aa0._28_4_ = auVar89._28_4_ + auVar85._28_4_;
                            local_2b20 = auVar64;
                            local_2b00 = pRVar65;
                          }
                          auVar100 = vsubps_avx512vl(auVar94,auVar97);
                          in_ZMM10 = ZEXT3264(auVar100);
                          auVar101 = vsubps_avx512vl(auVar95,auVar98);
                          in_ZMM11 = ZEXT3264(auVar101);
                          auVar102 = vsubps_avx512vl(auVar96,auVar99);
                          in_ZMM12 = ZEXT3264(auVar102);
                          auVar103 = vsubps_avx512vl(auVar87,auVar94);
                          auVar207 = ZEXT3264(auVar103);
                          auVar104 = vsubps_avx512vl(local_2b60,auVar95);
                          auVar105 = vsubps_avx512vl(local_2aa0,auVar96);
                          auVar85 = vmulps_avx512vl(auVar101,auVar105);
                          auVar106 = vfmsub231ps_avx512vl(auVar85,auVar104,auVar102);
                          auVar60._4_4_ = auVar102._4_4_ * auVar103._4_4_;
                          auVar60._0_4_ = auVar102._0_4_ * auVar103._0_4_;
                          auVar60._8_4_ = auVar102._8_4_ * auVar103._8_4_;
                          auVar60._12_4_ = auVar102._12_4_ * auVar103._12_4_;
                          auVar60._16_4_ = auVar102._16_4_ * auVar103._16_4_;
                          auVar60._20_4_ = auVar102._20_4_ * auVar103._20_4_;
                          auVar60._24_4_ = auVar102._24_4_ * auVar103._24_4_;
                          auVar60._28_4_ = auVar93._28_4_;
                          auVar107 = vfmsub231ps_avx512vl(auVar60,auVar105,auVar100);
                          uVar77 = auVar107._28_4_;
                          auVar124 = ZEXT436(uVar77);
                          auVar108 = vmulps_avx512vl(auVar100,auVar104);
                          auVar20 = vfmsub231ps_fma(auVar108,auVar103,auVar101);
                          auVar132 = (undefined1  [36])0x0;
                          auVar15 = vsubps_avx(auVar94,*(undefined1 (*) [32])ray);
                          auVar167 = ZEXT3264(auVar15);
                          auVar93 = vsubps_avx(auVar95,*(undefined1 (*) [32])(ray + 0x20));
                          auVar180 = ZEXT3264(auVar93);
                          auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [32])(ray + 0x40));
                          auVar193 = ZEXT3264(auVar96);
                          auVar85 = *(undefined1 (*) [32])(ray + 0x80);
                          auVar89 = *(undefined1 (*) [32])(ray + 0xa0);
                          auVar92 = *(undefined1 (*) [32])(ray + 0xc0);
                          auVar46._4_4_ = auVar89._4_4_ * auVar96._4_4_;
                          auVar46._0_4_ = auVar89._0_4_ * auVar96._0_4_;
                          auVar46._8_4_ = auVar89._8_4_ * auVar96._8_4_;
                          auVar46._12_4_ = auVar89._12_4_ * auVar96._12_4_;
                          auVar46._16_4_ = auVar89._16_4_ * auVar96._16_4_;
                          auVar46._20_4_ = auVar89._20_4_ * auVar96._20_4_;
                          auVar46._24_4_ = auVar89._24_4_ * auVar96._24_4_;
                          auVar46._28_4_ = auVar95._28_4_;
                          auVar163 = vfmsub231ps_fma(auVar46,auVar93,auVar92);
                          auVar47._4_4_ = auVar92._4_4_ * auVar15._4_4_;
                          auVar47._0_4_ = auVar92._0_4_ * auVar15._0_4_;
                          auVar47._8_4_ = auVar92._8_4_ * auVar15._8_4_;
                          auVar47._12_4_ = auVar92._12_4_ * auVar15._12_4_;
                          auVar47._16_4_ = auVar92._16_4_ * auVar15._16_4_;
                          auVar47._20_4_ = auVar92._20_4_ * auVar15._20_4_;
                          auVar47._24_4_ = auVar92._24_4_ * auVar15._24_4_;
                          auVar47._28_4_ = auVar94._28_4_;
                          auVar21 = vfmsub231ps_fma(auVar47,auVar96,auVar85);
                          auVar155 = ZEXT1664(auVar21);
                          auVar143._0_4_ = auVar85._0_4_ * auVar93._0_4_;
                          auVar143._4_4_ = auVar85._4_4_ * auVar93._4_4_;
                          auVar143._8_4_ = auVar85._8_4_ * auVar93._8_4_;
                          auVar143._12_4_ = auVar85._12_4_ * auVar93._12_4_;
                          auVar143._16_4_ = auVar85._16_4_ * auVar93._16_4_;
                          auVar143._20_4_ = auVar85._20_4_ * auVar93._20_4_;
                          auVar143._24_4_ = auVar85._24_4_ * auVar93._24_4_;
                          auVar143._28_36_ = auVar206;
                          auVar151 = vfmsub231ps_fma(auVar143._0_32_,auVar15,auVar89);
                          in_ZMM14 = ZEXT1664(auVar151);
                          auVar48._4_4_ = auVar92._4_4_ * auVar20._4_4_;
                          auVar48._0_4_ = auVar92._0_4_ * auVar20._0_4_;
                          auVar48._8_4_ = auVar92._8_4_ * auVar20._8_4_;
                          auVar48._12_4_ = auVar92._12_4_ * auVar20._12_4_;
                          auVar48._16_4_ = auVar92._16_4_ * 0.0;
                          auVar48._20_4_ = auVar92._20_4_ * 0.0;
                          auVar48._24_4_ = auVar92._24_4_ * 0.0;
                          auVar48._28_4_ = auVar92._28_4_;
                          auVar83 = vfmadd231ps_fma(auVar48,auVar107,auVar89);
                          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar106,auVar85);
                          auVar190 = ZEXT1664(auVar83);
                          vandps_avx512vl(ZEXT1632(auVar83),auVar215._0_32_);
                          in_ZMM13 = ZEXT3264(auVar108);
                          auVar85 = vmulps_avx512vl(auVar105,ZEXT1632(auVar151));
                          auVar85 = vfmadd231ps_avx512vl(auVar85,ZEXT1632(auVar21),auVar104);
                          auVar84 = vfmadd231ps_fma(auVar85,ZEXT1632(auVar163),auVar103);
                          uVar198 = auVar108._0_4_;
                          auVar142._0_4_ = (float)(uVar198 ^ auVar84._0_4_);
                          uVar201 = auVar108._4_4_;
                          auVar142._4_4_ = (float)(uVar201 ^ auVar84._4_4_);
                          uVar202 = auVar108._8_4_;
                          auVar142._8_4_ = (float)(uVar202 ^ auVar84._8_4_);
                          uVar203 = auVar108._12_4_;
                          auVar142._12_4_ = (float)(uVar203 ^ auVar84._12_4_);
                          fVar195 = auVar108._16_4_;
                          auVar142._16_4_ = fVar195;
                          fVar110 = auVar108._20_4_;
                          auVar142._20_4_ = fVar110;
                          fVar111 = auVar108._24_4_;
                          auVar142._24_4_ = fVar111;
                          uVar70 = auVar108._28_4_;
                          auVar142._28_4_ = uVar70;
                          auVar143 = ZEXT3264(auVar142);
                          uVar18 = vcmpps_avx512vl(auVar142,auVar86,5);
                          bVar72 = (byte)uVar18 & bVar75;
                          if (bVar72 != 0) {
                            auVar196._0_4_ = auVar102._0_4_ * auVar151._0_4_;
                            auVar196._4_4_ = auVar102._4_4_ * auVar151._4_4_;
                            auVar196._8_4_ = auVar102._8_4_ * auVar151._8_4_;
                            auVar196._12_4_ = auVar102._12_4_ * auVar151._12_4_;
                            auVar50._16_4_ = auVar102._16_4_ * 0.0;
                            auVar50._0_16_ = auVar196;
                            auVar50._20_4_ = auVar102._20_4_ * 0.0;
                            auVar50._24_4_ = auVar102._24_4_ * 0.0;
                            auVar50._28_4_ = auVar102._28_4_;
                            in_ZMM12 = ZEXT3264(auVar50);
                            auVar84 = vfmadd213ps_fma(auVar101,ZEXT1632(auVar21),auVar50);
                            in_ZMM11 = ZEXT1664(auVar84);
                            auVar84 = vfmadd213ps_fma(auVar100,ZEXT1632(auVar163),ZEXT1632(auVar84))
                            ;
                            in_ZMM10 = ZEXT1664(auVar84);
                            auVar153._0_4_ = (float)(uVar198 ^ auVar84._0_4_);
                            auVar153._4_4_ = (float)(uVar201 ^ auVar84._4_4_);
                            auVar153._8_4_ = (float)(uVar202 ^ auVar84._8_4_);
                            auVar153._12_4_ = (float)(uVar203 ^ auVar84._12_4_);
                            auVar153._16_4_ = fVar195;
                            auVar153._20_4_ = fVar110;
                            auVar153._24_4_ = fVar111;
                            auVar153._28_4_ = uVar70;
                            auVar155 = ZEXT3264(auVar153);
                            uVar18 = vcmpps_avx512vl(auVar153,auVar86,5);
                            bVar72 = bVar72 & (byte)uVar18;
                            if (bVar72 != 0) {
                              local_2a60 = auVar87;
                              local_2a40 = auVar91;
                              local_2a20 = auVar90;
                              local_2a00 = auVar99;
                              local_29e0 = auVar88;
                              local_29c0 = auVar98;
                              local_29a0 = auVar97;
                              in_ZMM11 = ZEXT864(0) << 0x20;
                              vandps_avx512vl(ZEXT1632(auVar83),auVar210._0_32_);
                              auVar85 = vsubps_avx(auVar97,auVar142);
                              in_ZMM10 = ZEXT3264(auVar85);
                              uVar18 = vcmpps_avx512vl(auVar85,auVar153,5);
                              bVar72 = bVar72 & (byte)uVar18;
                              if (bVar72 == 0) {
LAB_007aee74:
                                auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar88 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar82 = vxorps_avx512vl(auVar82,auVar82);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar124 = ZEXT436(uVar77);
                                auVar132 = (undefined1  [36])0x0;
                              }
                              else {
                                auVar52._4_4_ = auVar96._4_4_ * auVar20._4_4_;
                                auVar52._0_4_ = auVar96._0_4_ * auVar20._0_4_;
                                auVar52._8_4_ = auVar96._8_4_ * auVar20._8_4_;
                                auVar52._12_4_ = auVar96._12_4_ * auVar20._12_4_;
                                auVar52._16_4_ = auVar96._16_4_ * 0.0;
                                auVar52._20_4_ = auVar96._20_4_ * 0.0;
                                auVar52._24_4_ = auVar96._24_4_ * 0.0;
                                auVar52._28_4_ = auVar96._28_4_;
                                auVar84 = vfmadd213ps_fma(auVar93,auVar107,auVar52);
                                auVar84 = vfmadd213ps_fma(auVar15,auVar106,ZEXT1632(auVar84));
                                auVar163._0_4_ = uVar198 ^ auVar84._0_4_;
                                auVar163._4_4_ = uVar201 ^ auVar84._4_4_;
                                auVar163._8_4_ = uVar202 ^ auVar84._8_4_;
                                auVar163._12_4_ = uVar203 ^ auVar84._12_4_;
                                auVar166._16_4_ = fVar195;
                                auVar166._0_16_ = auVar163;
                                auVar166._20_4_ = fVar110;
                                auVar166._24_4_ = fVar111;
                                auVar166._28_4_ = uVar70;
                                auVar167 = ZEXT3264(auVar166);
                                auVar176._0_4_ = auVar97._0_4_ * *(float *)(ray + 0x60);
                                auVar176._4_4_ = auVar97._4_4_ * *(float *)(ray + 100);
                                auVar176._8_4_ = auVar97._8_4_ * *(float *)(ray + 0x68);
                                auVar176._12_4_ = auVar97._12_4_ * *(float *)(ray + 0x6c);
                                auVar176._16_4_ = auVar97._16_4_ * *(float *)(ray + 0x70);
                                auVar176._20_4_ = auVar97._20_4_ * *(float *)(ray + 0x74);
                                auVar176._24_4_ = auVar97._24_4_ * *(float *)(ray + 0x78);
                                auVar176._28_4_ = 0;
                                auVar180 = ZEXT3264(auVar176);
                                local_2860 = *(float *)(ray + 0x100);
                                fStack_285c = *(float *)(ray + 0x104);
                                fStack_2858 = *(float *)(ray + 0x108);
                                fStack_2854 = *(float *)(ray + 0x10c);
                                fStack_2850 = *(float *)(ray + 0x110);
                                fStack_284c = *(float *)(ray + 0x114);
                                fStack_2848 = *(float *)(ray + 0x118);
                                iStack_2844 = *(int *)(ray + 0x11c);
                                auVar84._0_4_ = *(float *)(ray + 0x100) * auVar97._0_4_;
                                auVar84._4_4_ = *(float *)(ray + 0x104) * auVar97._4_4_;
                                auVar84._8_4_ = *(float *)(ray + 0x108) * auVar97._8_4_;
                                auVar84._12_4_ = *(float *)(ray + 0x10c) * auVar97._12_4_;
                                auVar53._16_4_ = *(float *)(ray + 0x110) * auVar97._16_4_;
                                auVar53._0_16_ = auVar84;
                                auVar53._20_4_ = *(float *)(ray + 0x114) * auVar97._20_4_;
                                auVar53._24_4_ = *(float *)(ray + 0x118) * auVar97._24_4_;
                                auVar53._28_4_ = *(int *)(ray + 0x11c);
                                auVar193 = ZEXT3264(auVar53);
                                uVar18 = vcmpps_avx512vl(auVar166,auVar53,2);
                                uVar19 = vcmpps_avx512vl(auVar176,auVar166,1);
                                bVar72 = bVar72 & (byte)uVar18 & (byte)uVar19;
                                if (bVar72 == 0) goto LAB_007aee74;
                                uVar18 = vcmpps_avx512vl(ZEXT1632(auVar83),ZEXT832(0) << 0x20,4);
                                bVar72 = bVar72 & (byte)uVar18;
                                if (bVar72 == 0) goto LAB_007aee74;
                                uVar198 = pGVar3->mask;
                                auVar177._4_4_ = uVar198;
                                auVar177._0_4_ = uVar198;
                                auVar177._8_4_ = uVar198;
                                auVar177._12_4_ = uVar198;
                                auVar177._16_4_ = uVar198;
                                auVar177._20_4_ = uVar198;
                                auVar177._24_4_ = uVar198;
                                auVar177._28_4_ = uVar198;
                                auVar180 = ZEXT3264(auVar177);
                                uVar18 = vptestmd_avx512vl(auVar177,*(undefined1 (*) [32])
                                                                     (ray + 0x120));
                                bVar72 = bVar72 & (byte)uVar18;
                                uVar71 = (ulong)bVar72;
                                if (bVar72 == 0) goto LAB_007aee74;
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (auVar124 = ZEXT436(uVar77), auVar132 = (undefined1  [36])0x0,
                                   pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar88 = vrcp14ps_avx512vl(auVar97);
                                  auVar188._8_4_ = 0x3f800000;
                                  auVar188._0_8_ = &DAT_3f8000003f800000;
                                  auVar188._12_4_ = 0x3f800000;
                                  auVar188._16_4_ = 0x3f800000;
                                  auVar188._20_4_ = 0x3f800000;
                                  auVar188._24_4_ = 0x3f800000;
                                  auVar188._28_4_ = 0x3f800000;
                                  auVar83 = vfnmadd213ps_fma(auVar97,auVar88,auVar188);
                                  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar88,auVar88);
                                  auVar56._4_4_ = auVar83._4_4_ * auVar142._4_4_;
                                  auVar56._0_4_ = auVar83._0_4_ * auVar142._0_4_;
                                  auVar56._8_4_ = auVar83._8_4_ * auVar142._8_4_;
                                  auVar56._12_4_ = auVar83._12_4_ * auVar142._12_4_;
                                  auVar56._16_4_ = fVar195 * 0.0;
                                  auVar56._20_4_ = fVar110 * 0.0;
                                  auVar56._24_4_ = fVar111 * 0.0;
                                  auVar56._28_4_ = uVar70;
                                  local_2920 = vminps_avx(auVar56,auVar188);
                                  auVar143 = ZEXT3264(local_2920);
                                  auVar57._4_4_ = auVar83._4_4_ * auVar153._4_4_;
                                  auVar57._0_4_ = auVar83._0_4_ * auVar153._0_4_;
                                  auVar57._8_4_ = auVar83._8_4_ * auVar153._8_4_;
                                  auVar57._12_4_ = auVar83._12_4_ * auVar153._12_4_;
                                  auVar57._16_4_ = fVar195 * 0.0;
                                  auVar57._20_4_ = fVar110 * 0.0;
                                  auVar57._24_4_ = fVar111 * 0.0;
                                  auVar57._28_4_ = uVar70;
                                  local_2900 = vminps_avx(auVar57,auVar188);
                                  auVar155 = ZEXT3264(local_2900);
                                  pRVar6 = context->user;
                                  local_28c0 = vpbroadcastd_avx512vl();
                                  auVar180 = ZEXT3264(local_28c0);
                                  local_28e0 = vpbroadcastd_avx512vl();
                                  auVar190 = ZEXT3264(local_28e0);
                                  _local_2980 = auVar106;
                                  _local_2960 = auVar107;
                                  _local_2940 = ZEXT1632(auVar20);
                                  auVar88 = vpcmpeqd_avx2(auVar106,auVar106);
                                  local_2ab8[1] = auVar88;
                                  *local_2ab8 = auVar88;
                                  local_28a0 = pRVar6->instID[0];
                                  uStack_289c = local_28a0;
                                  uStack_2898 = local_28a0;
                                  uStack_2894 = local_28a0;
                                  uStack_2890 = local_28a0;
                                  uStack_288c = local_28a0;
                                  uStack_2888 = local_28a0;
                                  uStack_2884 = local_28a0;
                                  local_2880 = pRVar6->instPrimID[0];
                                  uStack_287c = local_2880;
                                  uStack_2878 = local_2880;
                                  uStack_2874 = local_2880;
                                  uStack_2870 = local_2880;
                                  uStack_286c = local_2880;
                                  uStack_2868 = local_2880;
                                  uStack_2864 = local_2880;
                                  auVar88 = vmulps_avx512vl(ZEXT1632(auVar83),auVar166);
                                  bVar79 = (bool)(bVar72 >> 1 & 1);
                                  bVar8 = (bool)(bVar72 >> 2 & 1);
                                  bVar9 = (bool)(bVar72 >> 3 & 1);
                                  bVar10 = (bool)(bVar72 >> 4 & 1);
                                  bVar11 = (bool)(bVar72 >> 5 & 1);
                                  bVar12 = (bool)(bVar72 >> 6 & 1);
                                  *(uint *)(ray + 0x100) =
                                       (uint)(bVar72 & 1) * auVar88._0_4_ |
                                       (uint)!(bool)(bVar72 & 1) * (int)local_2860;
                                  *(uint *)(ray + 0x104) =
                                       (uint)bVar79 * auVar88._4_4_ |
                                       (uint)!bVar79 * (int)fStack_285c;
                                  *(uint *)(ray + 0x108) =
                                       (uint)bVar8 * auVar88._8_4_ | (uint)!bVar8 * (int)fStack_2858
                                  ;
                                  *(uint *)(ray + 0x10c) =
                                       (uint)bVar9 * auVar88._12_4_ |
                                       (uint)!bVar9 * (int)fStack_2854;
                                  *(uint *)(ray + 0x110) =
                                       (uint)bVar10 * auVar88._16_4_ |
                                       (uint)!bVar10 * (int)fStack_2850;
                                  *(uint *)(ray + 0x114) =
                                       (uint)bVar11 * auVar88._20_4_ |
                                       (uint)!bVar11 * (int)fStack_284c;
                                  *(uint *)(ray + 0x118) =
                                       (uint)bVar12 * auVar88._24_4_ |
                                       (uint)!bVar12 * (int)fStack_2848;
                                  *(uint *)(ray + 0x11c) =
                                       (uint)(bVar72 >> 7) * auVar88._28_4_ |
                                       (uint)!(bool)(bVar72 >> 7) * iStack_2844;
                                  local_2b40 = vpmovm2d_avx512vl((ulong)bVar72);
                                  local_2b20._0_4_ = SUB84(local_2b40,0);
                                  local_2b20._4_4_ = (undefined4)((ulong)local_2b40 >> 0x20);
                                  fStack_2b18 = SUB84(pGVar3->userPtr,0);
                                  fStack_2b14 = (float)((ulong)pGVar3->userPtr >> 0x20);
                                  fStack_2b10 = SUB84(context->user,0);
                                  fStack_2b0c = (float)((ulong)context->user >> 0x20);
                                  local_2b00._0_4_ = SUB84((RTCHitN *)local_2980,0);
                                  local_2b00._4_4_ = (float)((ulong)local_2980 >> 0x20);
                                  fStack_2af8 = 1.12104e-44;
                                  local_2b20 = (undefined1  [8])local_2b40;
                                  local_2b00 = (RTCHitN *)local_2980;
                                  uStack_2b08 = ray;
                                  auVar124 = ZEXT436(uVar77);
                                  auVar132 = (undefined1  [36])0x0;
                                  if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    auVar132 = (undefined1  [36])0x0;
                                    auVar143 = ZEXT1664(local_2920._0_16_);
                                    auVar155 = ZEXT1664(local_2900._0_16_);
                                    auVar167 = ZEXT1664(auVar163);
                                    auVar180 = ZEXT1664(local_28c0._0_16_);
                                    auVar190 = ZEXT1664(local_28e0._0_16_);
                                    auVar193 = ZEXT1664(auVar84);
                                    in_ZMM10 = ZEXT1664(auVar85._0_16_);
                                    in_ZMM11 = ZEXT864(0) << 0x20;
                                    in_ZMM12 = ZEXT1664(auVar196);
                                    in_ZMM13 = ZEXT1664(auVar108._0_16_);
                                    in_ZMM14 = ZEXT1664(auVar151);
                                    auVar207 = ZEXT1664(auVar103._0_16_);
                                    (*pGVar3->occlusionFilterN)
                                              ((RTCFilterFunctionNArguments *)local_2b20);
                                    auVar124 = extraout_var;
                                  }
                                  uVar71 = vptestmd_avx512vl(local_2b40,local_2b40);
                                  if ((char)uVar71 != '\0') {
                                    p_Var7 = context->args->filter;
                                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                      auVar132 = (undefined1  [36])0x0;
                                      auVar143 = ZEXT1664(auVar143._0_16_);
                                      auVar155 = ZEXT1664(auVar155._0_16_);
                                      auVar167 = ZEXT1664(auVar167._0_16_);
                                      auVar180 = ZEXT1664(auVar180._0_16_);
                                      auVar190 = ZEXT1664(auVar190._0_16_);
                                      auVar193 = ZEXT1664(auVar193._0_16_);
                                      in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                      in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                      in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                      in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                      auVar207 = ZEXT1664(auVar207._0_16_);
                                      (*p_Var7)((RTCFilterFunctionNArguments *)local_2b20);
                                      auVar124 = extraout_var_00;
                                    }
                                    uVar71 = vptestmd_avx512vl(local_2b40,local_2b40);
                                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    bVar79 = (bool)((byte)uVar71 & 1);
                                    bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
                                    bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
                                    bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
                                    bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
                                    bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                                    bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                                    bVar14 = SUB81(uVar71 >> 7,0);
                                    *(uint *)(uStack_2b08 + 0x100) =
                                         (uint)bVar79 * auVar85._0_4_ |
                                         (uint)!bVar79 * *(int *)(uStack_2b08 + 0x100);
                                    *(uint *)(uStack_2b08 + 0x104) =
                                         (uint)bVar8 * auVar85._4_4_ |
                                         (uint)!bVar8 * *(int *)(uStack_2b08 + 0x104);
                                    *(uint *)(uStack_2b08 + 0x108) =
                                         (uint)bVar9 * auVar85._8_4_ |
                                         (uint)!bVar9 * *(int *)(uStack_2b08 + 0x108);
                                    *(uint *)(uStack_2b08 + 0x10c) =
                                         (uint)bVar10 * auVar85._12_4_ |
                                         (uint)!bVar10 * *(int *)(uStack_2b08 + 0x10c);
                                    *(uint *)(uStack_2b08 + 0x110) =
                                         (uint)bVar11 * auVar85._16_4_ |
                                         (uint)!bVar11 * *(int *)(uStack_2b08 + 0x110);
                                    *(uint *)(uStack_2b08 + 0x114) =
                                         (uint)bVar12 * auVar85._20_4_ |
                                         (uint)!bVar12 * *(int *)(uStack_2b08 + 0x114);
                                    *(uint *)(uStack_2b08 + 0x118) =
                                         (uint)bVar13 * auVar85._24_4_ |
                                         (uint)!bVar13 * *(int *)(uStack_2b08 + 0x118);
                                    *(uint *)(uStack_2b08 + 0x11c) =
                                         (uint)bVar14 * auVar85._28_4_ |
                                         (uint)!bVar14 * *(int *)(uStack_2b08 + 0x11c);
                                  }
                                  bVar79 = (bool)((byte)uVar71 & 1);
                                  bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
                                  bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
                                  bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
                                  bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
                                  bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                                  bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                                  bVar14 = SUB81(uVar71 >> 7,0);
                                  *(uint *)local_2b70 =
                                       (uint)bVar79 * *(int *)local_2b70 |
                                       (uint)!bVar79 * (int)local_2860;
                                  *(uint *)(local_2b70 + 4) =
                                       (uint)bVar8 * *(int *)(local_2b70 + 4) |
                                       (uint)!bVar8 * (int)fStack_285c;
                                  *(uint *)(local_2b70 + 8) =
                                       (uint)bVar9 * *(int *)(local_2b70 + 8) |
                                       (uint)!bVar9 * (int)fStack_2858;
                                  *(uint *)(local_2b70 + 0xc) =
                                       (uint)bVar10 * *(int *)(local_2b70 + 0xc) |
                                       (uint)!bVar10 * (int)fStack_2854;
                                  *(uint *)(local_2b70 + 0x10) =
                                       (uint)bVar11 * *(int *)(local_2b70 + 0x10) |
                                       (uint)!bVar11 * (int)fStack_2850;
                                  *(uint *)(local_2b70 + 0x14) =
                                       (uint)bVar12 * *(int *)(local_2b70 + 0x14) |
                                       (uint)!bVar12 * (int)fStack_284c;
                                  *(uint *)(local_2b70 + 0x18) =
                                       (uint)bVar13 * *(int *)(local_2b70 + 0x18) |
                                       (uint)!bVar13 * (int)fStack_2848;
                                  *(uint *)(local_2b70 + 0x1c) =
                                       (uint)bVar14 * *(int *)(local_2b70 + 0x1c) |
                                       (uint)!bVar14 * iStack_2844;
                                }
                                bVar75 = bVar75 & ~(byte)uVar71;
                                auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar88 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar82 = vxorps_avx512vl(auVar82,auVar82);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              }
                              auVar215 = ZEXT3264(auVar85);
                              auVar214 = ZEXT1664(auVar82);
                              auVar213 = ZEXT3264(auVar87);
                              auVar212 = ZEXT3264(auVar88);
                              auVar211 = ZEXT3264(auVar89);
                              auVar210 = ZEXT3264(auVar86);
                              auVar88 = local_29e0;
                              auVar87 = local_2a60;
                              auVar90 = local_2a20;
                              auVar91 = local_2a40;
                              auVar97 = local_29a0;
                              auVar98 = local_29c0;
                              auVar99 = local_2a00;
                            }
                          }
                          auVar82 = auVar214._0_16_;
                          if (bVar75 == 0) {
                            bVar79 = false;
                          }
                          else {
                            auVar86 = vsubps_avx512vl(auVar88,auVar87);
                            auVar87 = vsubps_avx512vl(auVar90,local_2b60);
                            auVar167 = ZEXT3264(auVar87);
                            auVar92 = vsubps_avx512vl(auVar91,local_2aa0);
                            in_ZMM10 = ZEXT3264(auVar92);
                            auVar97 = vsubps_avx512vl(auVar97,auVar88);
                            auVar98 = vsubps_avx512vl(auVar98,auVar90);
                            auVar207 = ZEXT3264(auVar98);
                            auVar99 = vsubps_avx512vl(auVar99,auVar91);
                            auVar85 = vmulps_avx512vl(auVar87,auVar99);
                            auVar84 = vfmsub231ps_fma(auVar85,auVar98,auVar92);
                            auVar155._0_4_ = auVar92._0_4_ * auVar97._0_4_;
                            auVar155._4_4_ = auVar92._4_4_ * auVar97._4_4_;
                            auVar155._8_4_ = auVar92._8_4_ * auVar97._8_4_;
                            auVar155._12_4_ = auVar92._12_4_ * auVar97._12_4_;
                            auVar155._16_4_ = auVar92._16_4_ * auVar97._16_4_;
                            auVar155._20_4_ = auVar92._20_4_ * auVar97._20_4_;
                            auVar155._24_4_ = auVar92._24_4_ * auVar97._24_4_;
                            auVar155._28_36_ = auVar124;
                            auVar95 = vfmsub231ps_avx512vl(auVar155._0_32_,auVar99,auVar86);
                            auVar180._0_4_ = auVar98._0_4_ * auVar86._0_4_;
                            auVar180._4_4_ = auVar98._4_4_ * auVar86._4_4_;
                            auVar180._8_4_ = auVar98._8_4_ * auVar86._8_4_;
                            auVar180._12_4_ = auVar98._12_4_ * auVar86._12_4_;
                            auVar180._16_4_ = auVar98._16_4_ * auVar86._16_4_;
                            auVar180._20_4_ = auVar98._20_4_ * auVar86._20_4_;
                            auVar180._24_4_ = auVar98._24_4_ * auVar86._24_4_;
                            auVar180._28_36_ = auVar132;
                            auVar20 = vfmsub231ps_fma(auVar180._0_32_,auVar97,auVar87);
                            auVar96 = vsubps_avx512vl(auVar88,*(undefined1 (*) [32])ray);
                            auVar155 = ZEXT3264(auVar96);
                            auVar90 = vsubps_avx512vl(auVar90,*(undefined1 (*) [32])(ray + 0x20));
                            auVar180 = ZEXT3264(auVar90);
                            auVar91 = vsubps_avx512vl(auVar91,*(undefined1 (*) [32])(ray + 0x40));
                            auVar193 = ZEXT3264(auVar91);
                            auVar85 = *(undefined1 (*) [32])(ray + 0x80);
                            auVar88 = *(undefined1 (*) [32])(ray + 0xa0);
                            auVar89 = *(undefined1 (*) [32])(ray + 0xc0);
                            auVar94 = vmulps_avx512vl(auVar88,auVar91);
                            auVar163 = vfmsub231ps_fma(auVar94,auVar90,auVar89);
                            in_ZMM12 = ZEXT1664(auVar163);
                            auVar199._0_4_ = auVar89._0_4_ * auVar96._0_4_;
                            auVar199._4_4_ = auVar89._4_4_ * auVar96._4_4_;
                            auVar199._8_4_ = auVar89._8_4_ * auVar96._8_4_;
                            auVar199._12_4_ = auVar89._12_4_ * auVar96._12_4_;
                            auVar199._16_4_ = auVar89._16_4_ * auVar96._16_4_;
                            auVar199._20_4_ = auVar89._20_4_ * auVar96._20_4_;
                            auVar199._28_36_ = in_ZMM13._28_36_;
                            auVar199._24_4_ = auVar89._24_4_ * auVar96._24_4_;
                            auVar21 = vfmsub231ps_fma(auVar199._0_32_,auVar91,auVar85);
                            in_ZMM13 = ZEXT1664(auVar21);
                            auVar204._0_4_ = auVar85._0_4_ * auVar90._0_4_;
                            auVar204._4_4_ = auVar85._4_4_ * auVar90._4_4_;
                            auVar204._8_4_ = auVar85._8_4_ * auVar90._8_4_;
                            auVar204._12_4_ = auVar85._12_4_ * auVar90._12_4_;
                            auVar204._16_4_ = auVar85._16_4_ * auVar90._16_4_;
                            auVar204._20_4_ = auVar85._20_4_ * auVar90._20_4_;
                            auVar204._28_36_ = in_ZMM14._28_36_;
                            auVar204._24_4_ = auVar85._24_4_ * auVar90._24_4_;
                            auVar94 = vfmsub231ps_avx512vl(auVar204._0_32_,auVar96,auVar88);
                            in_ZMM14 = ZEXT3264(auVar94);
                            auVar49._4_4_ = auVar89._4_4_ * auVar20._4_4_;
                            auVar49._0_4_ = auVar89._0_4_ * auVar20._0_4_;
                            auVar49._8_4_ = auVar89._8_4_ * auVar20._8_4_;
                            auVar49._12_4_ = auVar89._12_4_ * auVar20._12_4_;
                            auVar49._16_4_ = auVar89._16_4_ * 0.0;
                            auVar49._20_4_ = auVar89._20_4_ * 0.0;
                            auVar49._24_4_ = auVar89._24_4_ * 0.0;
                            auVar49._28_4_ = auVar89._28_4_;
                            auVar88 = vfmadd231ps_avx512vl(auVar49,auVar95,auVar88);
                            auVar83 = vfmadd231ps_fma(auVar88,ZEXT1632(auVar84),auVar85);
                            auVar190 = ZEXT1664(auVar83);
                            vandps_avx512vl(ZEXT1632(auVar83),auVar215._0_32_);
                            in_ZMM11 = ZEXT3264(auVar88);
                            auVar85 = vmulps_avx512vl(auVar99,auVar94);
                            auVar85 = vfmadd231ps_avx512vl(auVar85,ZEXT1632(auVar21),auVar98);
                            auVar85 = vfmadd231ps_avx512vl(auVar85,ZEXT1632(auVar163),auVar97);
                            auVar85 = vxorps_avx512vl(auVar88,auVar85);
                            auVar143 = ZEXT3264(auVar85);
                            uVar18 = vcmpps_avx512vl(auVar85,auVar214._0_32_,5);
                            bVar72 = (byte)uVar18 & bVar75;
                            if (bVar72 != 0) {
                              auVar51._4_4_ = auVar92._4_4_ * auVar94._4_4_;
                              auVar51._0_4_ = auVar92._0_4_ * auVar94._0_4_;
                              auVar51._8_4_ = auVar92._8_4_ * auVar94._8_4_;
                              auVar51._12_4_ = auVar92._12_4_ * auVar94._12_4_;
                              auVar51._16_4_ = auVar92._16_4_ * auVar94._16_4_;
                              auVar51._20_4_ = auVar92._20_4_ * auVar94._20_4_;
                              auVar51._24_4_ = auVar92._24_4_ * auVar94._24_4_;
                              auVar51._28_4_ = auVar92._28_4_;
                              in_ZMM10 = ZEXT3264(auVar51);
                              auVar151 = vfmadd213ps_fma(auVar87,ZEXT1632(auVar21),auVar51);
                              auVar163 = vfmadd213ps_fma(auVar86,ZEXT1632(auVar163),
                                                         ZEXT1632(auVar151));
                              auVar165._0_4_ = (float)(auVar88._0_4_ ^ auVar163._0_4_);
                              auVar165._4_4_ = (float)(auVar88._4_4_ ^ auVar163._4_4_);
                              auVar165._8_4_ = (float)(auVar88._8_4_ ^ auVar163._8_4_);
                              auVar165._12_4_ = (float)(auVar88._12_4_ ^ auVar163._12_4_);
                              fVar195 = auVar88._16_4_;
                              auVar165._16_4_ = fVar195;
                              fVar110 = auVar88._20_4_;
                              auVar165._20_4_ = fVar110;
                              fVar111 = auVar88._24_4_;
                              auVar165._24_4_ = fVar111;
                              uVar70 = auVar88._28_4_;
                              auVar165._28_4_ = uVar70;
                              auVar167 = ZEXT3264(auVar165);
                              uVar18 = vcmpps_avx512vl(auVar165,auVar214._0_32_,5);
                              bVar72 = bVar72 & (byte)uVar18;
                              if (bVar72 != 0) {
                                in_ZMM12 = ZEXT864(0) << 0x20;
                                vandps_avx512vl(ZEXT1632(auVar83),auVar210._0_32_);
                                auVar89 = vsubps_avx(auVar85,auVar85);
                                in_ZMM10 = ZEXT3264(auVar89);
                                uVar18 = vcmpps_avx512vl(auVar89,auVar165,5);
                                bVar72 = bVar72 & (byte)uVar18;
                                if (bVar72 != 0) {
                                  auVar54._4_4_ = auVar91._4_4_ * auVar20._4_4_;
                                  auVar54._0_4_ = auVar91._0_4_ * auVar20._0_4_;
                                  auVar54._8_4_ = auVar91._8_4_ * auVar20._8_4_;
                                  auVar54._12_4_ = auVar91._12_4_ * auVar20._12_4_;
                                  auVar54._16_4_ = auVar91._16_4_ * 0.0;
                                  auVar54._20_4_ = auVar91._20_4_ * 0.0;
                                  auVar54._24_4_ = auVar91._24_4_ * 0.0;
                                  auVar54._28_4_ = auVar91._28_4_;
                                  auVar163 = vfmadd213ps_fma(auVar90,auVar95,auVar54);
                                  auVar163 = vfmadd213ps_fma(auVar96,ZEXT1632(auVar84),
                                                             ZEXT1632(auVar163));
                                  auVar151._0_4_ = auVar88._0_4_ ^ auVar163._0_4_;
                                  auVar151._4_4_ = auVar88._4_4_ ^ auVar163._4_4_;
                                  auVar151._8_4_ = auVar88._8_4_ ^ auVar163._8_4_;
                                  auVar151._12_4_ = auVar88._12_4_ ^ auVar163._12_4_;
                                  auVar154._16_4_ = fVar195;
                                  auVar154._0_16_ = auVar151;
                                  auVar154._20_4_ = fVar110;
                                  auVar154._24_4_ = fVar111;
                                  auVar154._28_4_ = uVar70;
                                  auVar155 = ZEXT3264(auVar154);
                                  fVar112 = auVar85._0_4_;
                                  auVar178._0_4_ = fVar112 * *(float *)(ray + 0x60);
                                  fVar113 = auVar85._4_4_;
                                  auVar178._4_4_ = fVar113 * *(float *)(ray + 100);
                                  fVar114 = auVar85._8_4_;
                                  auVar178._8_4_ = fVar114 * *(float *)(ray + 0x68);
                                  fVar115 = auVar85._12_4_;
                                  auVar178._12_4_ = fVar115 * *(float *)(ray + 0x6c);
                                  fVar116 = auVar85._16_4_;
                                  auVar178._16_4_ = fVar116 * *(float *)(ray + 0x70);
                                  fVar117 = auVar85._20_4_;
                                  auVar178._20_4_ = fVar117 * *(float *)(ray + 0x74);
                                  fVar118 = auVar85._24_4_;
                                  auVar178._24_4_ = fVar118 * *(float *)(ray + 0x78);
                                  auVar178._28_4_ = 0;
                                  auVar180 = ZEXT3264(auVar178);
                                  pRVar1 = ray + 0x100;
                                  auVar63 = *(undefined1 (*) [28])pRVar1;
                                  iVar68 = *(int *)(ray + 0x11c);
                                  local_2aa0 = *(undefined1 (*) [32])pRVar1;
                                  auVar86 = local_2aa0;
                                  auVar191._0_4_ = *(float *)pRVar1 * fVar112;
                                  auVar191._4_4_ = *(float *)(ray + 0x104) * fVar113;
                                  auVar191._8_4_ = *(float *)(ray + 0x108) * fVar114;
                                  auVar191._12_4_ = *(float *)(ray + 0x10c) * fVar115;
                                  auVar55._16_4_ = *(float *)(ray + 0x110) * fVar116;
                                  auVar55._0_16_ = auVar191;
                                  auVar55._20_4_ = *(float *)(ray + 0x114) * fVar117;
                                  auVar55._24_4_ = *(float *)(ray + 0x118) * fVar118;
                                  auVar55._28_4_ = iVar68;
                                  auVar193 = ZEXT3264(auVar55);
                                  uVar18 = vcmpps_avx512vl(auVar154,auVar55,2);
                                  uVar19 = vcmpps_avx512vl(auVar178,auVar154,1);
                                  bVar72 = bVar72 & (byte)uVar18 & (byte)uVar19;
                                  if (bVar72 != 0) {
                                    uVar18 = vcmpps_avx512vl(ZEXT1632(auVar83),ZEXT832(0) << 0x20,4)
                                    ;
                                    bVar72 = bVar72 & (byte)uVar18;
                                    if (bVar72 != 0) {
                                      pGVar3 = (context->scene->geometries).items
                                               [*(uint *)(lVar76 + 0x40 + uVar80 * 4)].ptr;
                                      local_2b60._0_8_ = pGVar3;
                                      uVar77 = pGVar3->mask;
                                      auVar179._4_4_ = uVar77;
                                      auVar179._0_4_ = uVar77;
                                      auVar179._8_4_ = uVar77;
                                      auVar179._12_4_ = uVar77;
                                      auVar179._16_4_ = uVar77;
                                      auVar179._20_4_ = uVar77;
                                      auVar179._24_4_ = uVar77;
                                      auVar179._28_4_ = uVar77;
                                      auVar180 = ZEXT3264(auVar179);
                                      uVar18 = vptestmd_avx512vl(auVar179,*(undefined1 (*) [32])
                                                                           (ray + 0x120));
                                      bVar72 = bVar72 & (byte)uVar18;
                                      uVar71 = (ulong)bVar72;
                                      if (bVar72 != 0) {
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar87 = vrcp14ps_avx512vl(auVar85);
                                          auVar189._8_4_ = 0x3f800000;
                                          auVar189._0_8_ = &DAT_3f8000003f800000;
                                          auVar189._12_4_ = 0x3f800000;
                                          auVar189._16_4_ = 0x3f800000;
                                          auVar189._20_4_ = 0x3f800000;
                                          auVar189._24_4_ = 0x3f800000;
                                          auVar189._28_4_ = 0x3f800000;
                                          auVar83 = vfnmadd213ps_fma(auVar85,auVar87,auVar189);
                                          auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar87,
                                                                    auVar87);
                                          auVar58._4_4_ = auVar83._4_4_ * fVar113;
                                          auVar58._0_4_ = auVar83._0_4_ * fVar112;
                                          auVar58._8_4_ = auVar83._8_4_ * fVar114;
                                          auVar58._12_4_ = auVar83._12_4_ * fVar115;
                                          auVar58._16_4_ = fVar116 * 0.0;
                                          auVar58._20_4_ = fVar117 * 0.0;
                                          auVar58._24_4_ = fVar118 * 0.0;
                                          auVar58._28_4_ = auVar85._28_4_;
                                          auVar85 = vminps_avx(auVar58,auVar189);
                                          auVar59._4_4_ = auVar83._4_4_ * auVar165._4_4_;
                                          auVar59._0_4_ = auVar83._0_4_ * auVar165._0_4_;
                                          auVar59._8_4_ = auVar83._8_4_ * auVar165._8_4_;
                                          auVar59._12_4_ = auVar83._12_4_ * auVar165._12_4_;
                                          auVar59._16_4_ = fVar195 * 0.0;
                                          auVar59._20_4_ = fVar110 * 0.0;
                                          auVar59._24_4_ = fVar111 * 0.0;
                                          auVar59._28_4_ = uVar70;
                                          auVar87 = vminps_avx(auVar59,auVar189);
                                          local_2920 = vsubps_avx(auVar189,auVar85);
                                          auVar143 = ZEXT3264(local_2920);
                                          local_2900 = vsubps_avx(auVar189,auVar87);
                                          auVar167 = ZEXT3264(local_2900);
                                          pRVar6 = context->user;
                                          local_28c0 = vpbroadcastd_avx512vl();
                                          auVar180 = ZEXT3264(local_28c0);
                                          local_28e0 = vpbroadcastd_avx512vl();
                                          auVar190 = ZEXT3264(local_28e0);
                                          _local_2980 = ZEXT1632(auVar84);
                                          _local_2960 = auVar95;
                                          _local_2940 = ZEXT1632(auVar20);
                                          auVar85 = vpcmpeqd_avx2(_local_2980,_local_2980);
                                          local_2ab8[1] = auVar85;
                                          *local_2ab8 = auVar85;
                                          local_28a0 = pRVar6->instID[0];
                                          uStack_289c = local_28a0;
                                          uStack_2898 = local_28a0;
                                          uStack_2894 = local_28a0;
                                          uStack_2890 = local_28a0;
                                          uStack_288c = local_28a0;
                                          uStack_2888 = local_28a0;
                                          uStack_2884 = local_28a0;
                                          local_2880 = pRVar6->instPrimID[0];
                                          uStack_287c = local_2880;
                                          uStack_2878 = local_2880;
                                          uStack_2874 = local_2880;
                                          uStack_2870 = local_2880;
                                          uStack_286c = local_2880;
                                          uStack_2868 = local_2880;
                                          uStack_2864 = local_2880;
                                          local_2aa0._0_4_ = auVar63._0_4_;
                                          local_2aa0._4_4_ = auVar63._4_4_;
                                          local_2aa0._8_4_ = auVar63._8_4_;
                                          local_2aa0._12_4_ = auVar63._12_4_;
                                          local_2aa0._16_4_ = auVar63._16_4_;
                                          local_2aa0._20_4_ = auVar63._20_4_;
                                          local_2aa0._24_4_ = auVar63._24_4_;
                                          auVar85 = vmulps_avx512vl(ZEXT1632(auVar83),auVar154);
                                          bVar79 = (bool)(bVar72 >> 1 & 1);
                                          bVar8 = (bool)(bVar72 >> 2 & 1);
                                          bVar9 = (bool)(bVar72 >> 3 & 1);
                                          bVar10 = (bool)(bVar72 >> 4 & 1);
                                          bVar11 = (bool)(bVar72 >> 5 & 1);
                                          bVar12 = (bool)(bVar72 >> 6 & 1);
                                          *(uint *)(ray + 0x100) =
                                               (uint)(bVar72 & 1) * auVar85._0_4_ |
                                               (uint)!(bool)(bVar72 & 1) * local_2aa0._0_4_;
                                          *(uint *)(ray + 0x104) =
                                               (uint)bVar79 * auVar85._4_4_ |
                                               (uint)!bVar79 * local_2aa0._4_4_;
                                          *(uint *)(ray + 0x108) =
                                               (uint)bVar8 * auVar85._8_4_ |
                                               (uint)!bVar8 * local_2aa0._8_4_;
                                          *(uint *)(ray + 0x10c) =
                                               (uint)bVar9 * auVar85._12_4_ |
                                               (uint)!bVar9 * local_2aa0._12_4_;
                                          *(uint *)(ray + 0x110) =
                                               (uint)bVar10 * auVar85._16_4_ |
                                               (uint)!bVar10 * local_2aa0._16_4_;
                                          *(uint *)(ray + 0x114) =
                                               (uint)bVar11 * auVar85._20_4_ |
                                               (uint)!bVar11 * local_2aa0._20_4_;
                                          *(uint *)(ray + 0x118) =
                                               (uint)bVar12 * auVar85._24_4_ |
                                               (uint)!bVar12 * local_2aa0._24_4_;
                                          *(uint *)(ray + 0x11c) =
                                               (uint)(bVar72 >> 7) * auVar85._28_4_ |
                                               (uint)!(bool)(bVar72 >> 7) * iVar68;
                                          local_2b40 = vpmovm2d_avx512vl(uVar71);
                                          local_2b20._0_4_ = SUB84(local_2b40,0);
                                          local_2b20._4_4_ = (undefined4)((ulong)local_2b40 >> 0x20)
                                          ;
                                          fStack_2b18 = SUB84(pGVar3->userPtr,0);
                                          fStack_2b14 = (float)((ulong)pGVar3->userPtr >> 0x20);
                                          fStack_2b10 = SUB84(context->user,0);
                                          fStack_2b0c = (float)((ulong)context->user >> 0x20);
                                          local_2b00._0_4_ = SUB84((RTCHitN *)local_2980,0);
                                          local_2b00._4_4_ = (float)((ulong)local_2980 >> 0x20);
                                          fStack_2af8 = 1.12104e-44;
                                          local_2aa0 = auVar86;
                                          local_2b20 = (undefined1  [8])local_2b40;
                                          local_2b00 = (RTCHitN *)local_2980;
                                          uStack_2b08 = ray;
                                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                            auVar143 = ZEXT1664(local_2920._0_16_);
                                            auVar155 = ZEXT1664(auVar151);
                                            auVar167 = ZEXT1664(local_2900._0_16_);
                                            auVar180 = ZEXT1664(local_28c0._0_16_);
                                            auVar190 = ZEXT1664(local_28e0._0_16_);
                                            auVar193 = ZEXT1664(auVar191);
                                            in_ZMM10 = ZEXT1664(auVar89._0_16_);
                                            in_ZMM11 = ZEXT1664(auVar88._0_16_);
                                            in_ZMM12 = ZEXT864(0) << 0x20;
                                            in_ZMM13 = ZEXT1664(auVar21);
                                            in_ZMM14 = ZEXT1664(auVar94._0_16_);
                                            auVar207 = ZEXT1664(auVar98._0_16_);
                                            (*pGVar3->occlusionFilterN)
                                                      ((RTCFilterFunctionNArguments *)local_2b20);
                                          }
                                          uVar71 = vptestmd_avx512vl(local_2b40,local_2b40);
                                          if ((char)uVar71 != '\0') {
                                            p_Var7 = context->args->filter;
                                            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                ((*(byte *)(local_2b60._0_8_ + 0x3e) & 0x40) != 0)))
                                               ) {
                                              auVar143 = ZEXT1664(auVar143._0_16_);
                                              auVar155 = ZEXT1664(auVar155._0_16_);
                                              auVar167 = ZEXT1664(auVar167._0_16_);
                                              auVar180 = ZEXT1664(auVar180._0_16_);
                                              auVar190 = ZEXT1664(auVar190._0_16_);
                                              auVar193 = ZEXT1664(auVar193._0_16_);
                                              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                                              in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                                              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                                              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                              auVar207 = ZEXT1664(auVar207._0_16_);
                                              (*p_Var7)((RTCFilterFunctionNArguments *)local_2b20);
                                            }
                                            uVar71 = vptestmd_avx512vl(local_2b40,local_2b40);
                                            auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                            bVar79 = (bool)((byte)uVar71 & 1);
                                            bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
                                            bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
                                            bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
                                            bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
                                            bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                                            bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                                            bVar14 = SUB81(uVar71 >> 7,0);
                                            *(uint *)(uStack_2b08 + 0x100) =
                                                 (uint)bVar79 * auVar85._0_4_ |
                                                 (uint)!bVar79 * *(int *)(uStack_2b08 + 0x100);
                                            *(uint *)(uStack_2b08 + 0x104) =
                                                 (uint)bVar8 * auVar85._4_4_ |
                                                 (uint)!bVar8 * *(int *)(uStack_2b08 + 0x104);
                                            *(uint *)(uStack_2b08 + 0x108) =
                                                 (uint)bVar9 * auVar85._8_4_ |
                                                 (uint)!bVar9 * *(int *)(uStack_2b08 + 0x108);
                                            *(uint *)(uStack_2b08 + 0x10c) =
                                                 (uint)bVar10 * auVar85._12_4_ |
                                                 (uint)!bVar10 * *(int *)(uStack_2b08 + 0x10c);
                                            *(uint *)(uStack_2b08 + 0x110) =
                                                 (uint)bVar11 * auVar85._16_4_ |
                                                 (uint)!bVar11 * *(int *)(uStack_2b08 + 0x110);
                                            *(uint *)(uStack_2b08 + 0x114) =
                                                 (uint)bVar12 * auVar85._20_4_ |
                                                 (uint)!bVar12 * *(int *)(uStack_2b08 + 0x114);
                                            *(uint *)(uStack_2b08 + 0x118) =
                                                 (uint)bVar13 * auVar85._24_4_ |
                                                 (uint)!bVar13 * *(int *)(uStack_2b08 + 0x118);
                                            *(uint *)(uStack_2b08 + 0x11c) =
                                                 (uint)bVar14 * auVar85._28_4_ |
                                                 (uint)!bVar14 * *(int *)(uStack_2b08 + 0x11c);
                                          }
                                          bVar79 = (bool)((byte)uVar71 & 1);
                                          auVar109._0_4_ =
                                               (uint)bVar79 * *(int *)local_2b70 |
                                               (uint)!bVar79 * local_2aa0._0_4_;
                                          bVar79 = (bool)((byte)(uVar71 >> 1) & 1);
                                          auVar109._4_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 4) |
                                               (uint)!bVar79 * local_2aa0._4_4_;
                                          bVar79 = (bool)((byte)(uVar71 >> 2) & 1);
                                          auVar109._8_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 8) |
                                               (uint)!bVar79 * local_2aa0._8_4_;
                                          bVar79 = (bool)((byte)(uVar71 >> 3) & 1);
                                          auVar109._12_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 0xc) |
                                               (uint)!bVar79 * local_2aa0._12_4_;
                                          bVar79 = (bool)((byte)(uVar71 >> 4) & 1);
                                          auVar109._16_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 0x10) |
                                               (uint)!bVar79 * local_2aa0._16_4_;
                                          bVar79 = (bool)((byte)(uVar71 >> 5) & 1);
                                          auVar109._20_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 0x14) |
                                               (uint)!bVar79 * local_2aa0._20_4_;
                                          bVar79 = (bool)((byte)(uVar71 >> 6) & 1);
                                          auVar109._24_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 0x18) |
                                               (uint)!bVar79 * local_2aa0._24_4_;
                                          bVar79 = SUB81(uVar71 >> 7,0);
                                          auVar109._28_4_ =
                                               (uint)bVar79 * *(int *)(local_2b70 + 0x1c) |
                                               (uint)!bVar79 * local_2aa0._28_4_;
                                          *(undefined1 (*) [32])local_2b70 = auVar109;
                                        }
                                        bVar75 = bVar75 & ~(byte)uVar71;
                                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                        auVar210 = ZEXT3264(auVar85);
                                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                        auVar211 = ZEXT3264(auVar85);
                                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        auVar212 = ZEXT3264(auVar85);
                                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                        auVar213 = ZEXT3264(auVar85);
                                        auVar82 = vxorps_avx512vl(auVar82,auVar82);
                                        auVar214 = ZEXT1664(auVar82);
                                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                        auVar215 = ZEXT3264(auVar85);
                                        goto LAB_007aea18;
                                      }
                                    }
                                  }
                                }
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar210 = ZEXT3264(auVar85);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar211 = ZEXT3264(auVar85);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar212 = ZEXT3264(auVar85);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar213 = ZEXT3264(auVar85);
                                auVar82 = vxorps_avx512vl(auVar82,auVar82);
                                auVar214 = ZEXT1664(auVar82);
                                auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar215 = ZEXT3264(auVar85);
                              }
                            }
LAB_007aea18:
                            bVar79 = bVar75 != 0;
                          }
                          if ((!bVar79) || (bVar79 = 2 < uVar80, uVar80 = uVar80 + 1, bVar79))
                          break;
                        }
                        bVar66 = bVar66 & bVar75;
                      } while ((bVar66 != 0) && (uVar80 = local_2a68 + 1, uVar80 < local_2a70));
                      bVar66 = ~bVar66;
                    }
                    bVar67 = bVar67 | bVar66;
                    uVar80 = local_2aa8;
                    if (bVar67 == 0xff) goto LAB_007af625;
                    auVar85 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    local_2640._0_4_ =
                         (uint)(bVar67 & 1) * auVar85._0_4_ |
                         (uint)!(bool)(bVar67 & 1) * local_2640._0_4_;
                    bVar79 = (bool)(bVar67 >> 1 & 1);
                    local_2640._4_4_ =
                         (uint)bVar79 * auVar85._4_4_ | (uint)!bVar79 * local_2640._4_4_;
                    bVar79 = (bool)(bVar67 >> 2 & 1);
                    local_2640._8_4_ =
                         (uint)bVar79 * auVar85._8_4_ | (uint)!bVar79 * local_2640._8_4_;
                    bVar79 = (bool)(bVar67 >> 3 & 1);
                    local_2640._12_4_ =
                         (uint)bVar79 * auVar85._12_4_ | (uint)!bVar79 * local_2640._12_4_;
                    bVar79 = (bool)(bVar67 >> 4 & 1);
                    local_2640._16_4_ =
                         (uint)bVar79 * auVar85._16_4_ | (uint)!bVar79 * local_2640._16_4_;
                    bVar79 = (bool)(bVar67 >> 5 & 1);
                    local_2640._20_4_ =
                         (uint)bVar79 * auVar85._20_4_ | (uint)!bVar79 * local_2640._20_4_;
                    bVar79 = (bool)(bVar67 >> 6 & 1);
                    local_2640._24_4_ =
                         (uint)bVar79 * auVar85._24_4_ | (uint)!bVar79 * local_2640._24_4_;
                    local_2640._28_4_ =
                         (uint)(bVar67 >> 7) * auVar85._28_4_ |
                         (uint)!(bool)(bVar67 >> 7) * local_2640._28_4_;
                    iVar68 = 0;
                    break;
                  }
                  goto LAB_007af636;
                }
                uVar69 = root.ptr & 0xfffffffffffffff0;
                auVar207 = ZEXT3264(auVar213._0_32_);
                uVar71 = 0;
                root.ptr = 8;
                do {
                  uVar74 = *(ulong *)(uVar69 + uVar71 * 8);
                  if (uVar74 != 8) {
                    uVar70 = *(undefined4 *)(uVar69 + 0x80 + uVar71 * 4);
                    auVar141._4_4_ = uVar70;
                    auVar141._0_4_ = uVar70;
                    auVar141._8_4_ = uVar70;
                    auVar141._12_4_ = uVar70;
                    auVar141._16_4_ = uVar70;
                    auVar141._20_4_ = uVar70;
                    auVar141._24_4_ = uVar70;
                    auVar141._28_4_ = uVar70;
                    auVar88 = *(undefined1 (*) [32])(ray + 0xe0);
                    uVar70 = *(undefined4 *)(uVar69 + 0x20 + uVar71 * 4);
                    auVar22._4_4_ = uVar70;
                    auVar22._0_4_ = uVar70;
                    auVar22._8_4_ = uVar70;
                    auVar22._12_4_ = uVar70;
                    auVar22._16_4_ = uVar70;
                    auVar22._20_4_ = uVar70;
                    auVar22._24_4_ = uVar70;
                    auVar22._28_4_ = uVar70;
                    auVar89 = vfmadd213ps_avx512vl(auVar141,auVar88,auVar22);
                    uVar70 = *(undefined4 *)(uVar69 + 0xa0 + uVar71 * 4);
                    auVar152._4_4_ = uVar70;
                    auVar152._0_4_ = uVar70;
                    auVar152._8_4_ = uVar70;
                    auVar152._12_4_ = uVar70;
                    auVar152._16_4_ = uVar70;
                    auVar152._20_4_ = uVar70;
                    auVar152._24_4_ = uVar70;
                    auVar152._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar69 + 0x40 + uVar71 * 4);
                    auVar23._4_4_ = uVar70;
                    auVar23._0_4_ = uVar70;
                    auVar23._8_4_ = uVar70;
                    auVar23._12_4_ = uVar70;
                    auVar23._16_4_ = uVar70;
                    auVar23._20_4_ = uVar70;
                    auVar23._24_4_ = uVar70;
                    auVar23._28_4_ = uVar70;
                    auVar86 = vfmadd213ps_avx512vl(auVar152,auVar88,auVar23);
                    uVar70 = *(undefined4 *)(uVar69 + 0xc0 + uVar71 * 4);
                    auVar164._4_4_ = uVar70;
                    auVar164._0_4_ = uVar70;
                    auVar164._8_4_ = uVar70;
                    auVar164._12_4_ = uVar70;
                    auVar164._16_4_ = uVar70;
                    auVar164._20_4_ = uVar70;
                    auVar164._24_4_ = uVar70;
                    auVar164._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar69 + 0x60 + uVar71 * 4);
                    auVar24._4_4_ = uVar70;
                    auVar24._0_4_ = uVar70;
                    auVar24._8_4_ = uVar70;
                    auVar24._12_4_ = uVar70;
                    auVar24._16_4_ = uVar70;
                    auVar24._20_4_ = uVar70;
                    auVar24._24_4_ = uVar70;
                    auVar24._28_4_ = uVar70;
                    auVar87 = vfmadd213ps_avx512vl(auVar164,auVar88,auVar24);
                    uVar70 = *(undefined4 *)(uVar69 + 0x90 + uVar71 * 4);
                    auVar175._4_4_ = uVar70;
                    auVar175._0_4_ = uVar70;
                    auVar175._8_4_ = uVar70;
                    auVar175._12_4_ = uVar70;
                    auVar175._16_4_ = uVar70;
                    auVar175._20_4_ = uVar70;
                    auVar175._24_4_ = uVar70;
                    auVar175._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar69 + 0x30 + uVar71 * 4);
                    auVar25._4_4_ = uVar70;
                    auVar25._0_4_ = uVar70;
                    auVar25._8_4_ = uVar70;
                    auVar25._12_4_ = uVar70;
                    auVar25._16_4_ = uVar70;
                    auVar25._20_4_ = uVar70;
                    auVar25._24_4_ = uVar70;
                    auVar25._28_4_ = uVar70;
                    auVar90 = vfmadd213ps_avx512vl(auVar175,auVar88,auVar25);
                    uVar70 = *(undefined4 *)(uVar69 + 0xb0 + uVar71 * 4);
                    auVar187._4_4_ = uVar70;
                    auVar187._0_4_ = uVar70;
                    auVar187._8_4_ = uVar70;
                    auVar187._12_4_ = uVar70;
                    auVar187._16_4_ = uVar70;
                    auVar187._20_4_ = uVar70;
                    auVar187._24_4_ = uVar70;
                    auVar187._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar69 + 0x50 + uVar71 * 4);
                    auVar26._4_4_ = uVar70;
                    auVar26._0_4_ = uVar70;
                    auVar26._8_4_ = uVar70;
                    auVar26._12_4_ = uVar70;
                    auVar26._16_4_ = uVar70;
                    auVar26._20_4_ = uVar70;
                    auVar26._24_4_ = uVar70;
                    auVar26._28_4_ = uVar70;
                    auVar91 = vfmadd213ps_avx512vl(auVar187,auVar88,auVar26);
                    uVar70 = *(undefined4 *)(uVar69 + 0xd0 + uVar71 * 4);
                    auVar192._4_4_ = uVar70;
                    auVar192._0_4_ = uVar70;
                    auVar192._8_4_ = uVar70;
                    auVar192._12_4_ = uVar70;
                    auVar192._16_4_ = uVar70;
                    auVar192._20_4_ = uVar70;
                    auVar192._24_4_ = uVar70;
                    auVar192._28_4_ = uVar70;
                    uVar70 = *(undefined4 *)(uVar69 + 0x70 + uVar71 * 4);
                    auVar27._4_4_ = uVar70;
                    auVar27._0_4_ = uVar70;
                    auVar27._8_4_ = uVar70;
                    auVar27._12_4_ = uVar70;
                    auVar27._16_4_ = uVar70;
                    auVar27._20_4_ = uVar70;
                    auVar27._24_4_ = uVar70;
                    auVar27._28_4_ = uVar70;
                    auVar92 = vfmadd213ps_avx512vl(auVar192,auVar88,auVar27);
                    in_ZMM11 = ZEXT3264(local_2740);
                    auVar61._4_4_ = fStack_271c;
                    auVar61._0_4_ = local_2720;
                    auVar61._8_4_ = fStack_2718;
                    auVar61._12_4_ = fStack_2714;
                    auVar61._16_4_ = fStack_2710;
                    auVar61._20_4_ = fStack_270c;
                    auVar61._24_4_ = fStack_2708;
                    auVar61._28_4_ = uStack_2704;
                    in_ZMM12 = ZEXT3264(auVar61);
                    auVar82 = vfmsub213ps_fma(auVar89,local_2780,auVar61);
                    auVar62._4_4_ = fStack_26fc;
                    auVar62._0_4_ = local_2700;
                    auVar62._8_4_ = fStack_26f8;
                    auVar62._12_4_ = fStack_26f4;
                    auVar62._16_4_ = fStack_26f0;
                    auVar62._20_4_ = fStack_26ec;
                    auVar62._24_4_ = fStack_26e8;
                    auVar62._28_4_ = uStack_26e4;
                    in_ZMM13 = ZEXT3264(auVar62);
                    auVar83 = vfmsub213ps_fma(auVar86,local_2760,auVar62);
                    in_ZMM14 = ZEXT3264(local_26e0);
                    auVar84 = vfmsub213ps_fma(auVar87,local_2740,local_26e0);
                    auVar167 = ZEXT1664(auVar84);
                    auVar20 = vfmsub213ps_fma(auVar90,local_2780,auVar61);
                    auVar180 = ZEXT1664(auVar20);
                    auVar163 = vfmsub213ps_fma(auVar91,local_2760,auVar62);
                    auVar190 = ZEXT1664(auVar163);
                    auVar21 = vfmsub213ps_fma(auVar92,local_2740,local_26e0);
                    auVar193 = ZEXT1664(auVar21);
                    auVar89 = vpminsd_avx2(ZEXT1632(auVar82),ZEXT1632(auVar20));
                    auVar86 = vpminsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar163));
                    auVar89 = vpmaxsd_avx2(auVar89,auVar86);
                    auVar86 = vpminsd_avx2(ZEXT1632(auVar84),ZEXT1632(auVar21));
                    in_ZMM10 = ZEXT3264(auVar86);
                    auVar89 = vpmaxsd_avx2(auVar89,auVar86);
                    auVar86 = vpmaxsd_avx2(ZEXT1632(auVar82),ZEXT1632(auVar20));
                    auVar87 = vpmaxsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar163));
                    auVar87 = vpminsd_avx2(auVar86,auVar87);
                    auVar86 = vpmaxsd_avx2(ZEXT1632(auVar84),ZEXT1632(auVar21));
                    auVar87 = vpminsd_avx2(auVar87,auVar86);
                    auVar86 = vpmaxsd_avx2(auVar89,local_2660);
                    auVar143 = ZEXT3264(auVar86);
                    auVar87 = vpminsd_avx2(auVar87,local_2640);
                    auVar155 = ZEXT3264(auVar87);
                    uVar81 = vcmpps_avx512vl(auVar86,auVar87,2);
                    if ((uVar77 & 7) == 6) {
                      uVar70 = *(undefined4 *)(uVar69 + 0xe0 + uVar71 * 4);
                      auVar28._4_4_ = uVar70;
                      auVar28._0_4_ = uVar70;
                      auVar28._8_4_ = uVar70;
                      auVar28._12_4_ = uVar70;
                      auVar28._16_4_ = uVar70;
                      auVar28._20_4_ = uVar70;
                      auVar28._24_4_ = uVar70;
                      auVar28._28_4_ = uVar70;
                      uVar16 = vcmpps_avx512vl(auVar88,auVar28,0xd);
                      uVar70 = *(undefined4 *)(uVar69 + 0xf0 + uVar71 * 4);
                      auVar29._4_4_ = uVar70;
                      auVar29._0_4_ = uVar70;
                      auVar29._8_4_ = uVar70;
                      auVar29._12_4_ = uVar70;
                      auVar29._16_4_ = uVar70;
                      auVar29._20_4_ = uVar70;
                      auVar29._24_4_ = uVar70;
                      auVar29._28_4_ = uVar70;
                      uVar17 = vcmpps_avx512vl(auVar88,auVar29,1);
                      uVar81 = uVar81 & uVar16 & uVar17;
                    }
                    uVar16 = vcmpps_avx512vl(local_2640,auVar85,6);
                    uVar81 = uVar81 & uVar16;
                    if ((byte)uVar81 != 0) {
                      auVar89 = vblendmps_avx512vl(auVar213._0_32_,auVar89);
                      bVar79 = (bool)((byte)uVar81 & 1);
                      bVar8 = (bool)((byte)(uVar81 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar81 >> 2) & 1);
                      bVar10 = (bool)((byte)(uVar81 >> 3) & 1);
                      bVar11 = (bool)((byte)(uVar81 >> 4) & 1);
                      bVar12 = (bool)((byte)(uVar81 >> 5) & 1);
                      bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
                      bVar14 = SUB81(uVar81 >> 7,0);
                      if (root.ptr != 8) {
                        *puVar78 = root.ptr;
                        puVar78 = puVar78 + 1;
                        *pauVar73 = auVar207._0_32_;
                        pauVar73 = pauVar73 + 1;
                      }
                      auVar207 = ZEXT3264(CONCAT428((uint)bVar14 * auVar89._28_4_ |
                                                    (uint)!bVar14 * auVar88._28_4_,
                                                    CONCAT424((uint)bVar13 * auVar89._24_4_ |
                                                              (uint)!bVar13 * auVar88._24_4_,
                                                              CONCAT420((uint)bVar12 *
                                                                        auVar89._20_4_ |
                                                                        (uint)!bVar12 *
                                                                        auVar88._20_4_,
                                                                        CONCAT416((uint)bVar11 *
                                                                                  auVar89._16_4_ |
                                                                                  (uint)!bVar11 *
                                                                                  auVar88._16_4_,
                                                                                  CONCAT412((uint)
                                                  bVar10 * auVar89._12_4_ |
                                                  (uint)!bVar10 * auVar88._12_4_,
                                                  CONCAT48((uint)bVar9 * auVar89._8_4_ |
                                                           (uint)!bVar9 * auVar88._8_4_,
                                                           CONCAT44((uint)bVar8 * auVar89._4_4_ |
                                                                    (uint)!bVar8 * auVar88._4_4_,
                                                                    (uint)bVar79 * auVar89._0_4_ |
                                                                    (uint)!bVar79 * auVar88._0_4_)))
                                                  )))));
                      root.ptr = uVar74;
                    }
                  }
                } while ((uVar74 != 8) && (bVar79 = uVar71 < 3, uVar71 = uVar71 + 1, bVar79));
                iVar68 = 0;
                if (root.ptr == 8) {
LAB_007ae641:
                  bVar79 = false;
                  iVar68 = 4;
                }
                else {
                  uVar18 = vcmpps_avx512vl(auVar207._0_32_,local_2640,9);
                  bVar79 = true;
                  if ((uint)POPCOUNT((int)uVar18) <= (uint)local_2aa8) {
                    *puVar78 = root.ptr;
                    puVar78 = puVar78 + 1;
                    *pauVar73 = auVar207._0_32_;
                    pauVar73 = pauVar73 + 1;
                    goto LAB_007ae641;
                  }
                }
              } while (bVar79);
            }
          }
        }
      } while (iVar68 != 3);
      bVar67 = bVar67 & (byte)local_2b64;
      bVar79 = (bool)(bVar67 >> 1 & 1);
      bVar8 = (bool)(bVar67 >> 2 & 1);
      bVar9 = (bool)(bVar67 >> 3 & 1);
      bVar10 = (bool)(bVar67 >> 4 & 1);
      bVar11 = (bool)(bVar67 >> 5 & 1);
      bVar12 = (bool)(bVar67 >> 6 & 1);
      *(uint *)local_2b70 =
           (uint)(bVar67 & 1) * auVar212._0_4_ | (uint)!(bool)(bVar67 & 1) * *(int *)local_2b70;
      *(uint *)(local_2b70 + 4) =
           (uint)bVar79 * auVar212._4_4_ | (uint)!bVar79 * *(int *)(local_2b70 + 4);
      *(uint *)(local_2b70 + 8) =
           (uint)bVar8 * auVar212._8_4_ | (uint)!bVar8 * *(int *)(local_2b70 + 8);
      *(uint *)(local_2b70 + 0xc) =
           (uint)bVar9 * auVar212._12_4_ | (uint)!bVar9 * *(int *)(local_2b70 + 0xc);
      *(uint *)(local_2b70 + 0x10) =
           (uint)bVar10 * auVar212._16_4_ | (uint)!bVar10 * *(int *)(local_2b70 + 0x10);
      *(uint *)(local_2b70 + 0x14) =
           (uint)bVar11 * auVar212._20_4_ | (uint)!bVar11 * *(int *)(local_2b70 + 0x14);
      *(uint *)(local_2b70 + 0x18) =
           (uint)bVar12 * auVar212._24_4_ | (uint)!bVar12 * *(int *)(local_2b70 + 0x18);
      *(uint *)(local_2b70 + 0x1c) =
           (uint)(bVar67 >> 7) * auVar212._28_4_ |
           (uint)!(bool)(bVar67 >> 7) * *(int *)(local_2b70 + 0x1c);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }